

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [28];
  undefined1 auVar112 [24];
  uint uVar113;
  int iVar114;
  uint uVar115;
  ulong uVar116;
  uint uVar117;
  ulong uVar118;
  ulong uVar119;
  long lVar120;
  undefined4 uVar121;
  undefined8 uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar124 [16];
  undefined1 auVar138 [32];
  undefined1 auVar125 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar170 [32];
  undefined1 auVar159 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar156;
  undefined1 auVar158 [16];
  float fVar157;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar176 [32];
  undefined1 auVar169 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined8 uVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar232 [64];
  undefined4 uVar233;
  undefined1 auVar234 [16];
  float fVar235;
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar241;
  undefined1 in_ZMM12 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  float fVar242;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_960 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 (*local_748) [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  LinearSpace3fa *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  int local_4c0;
  int local_4bc;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_460 [32];
  float local_440 [4];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar183 [32];
  
  PVar15 = prim[1];
  uVar119 = (ulong)(byte)PVar15;
  fVar157 = *(float *)(prim + uVar119 * 0x19 + 0x12);
  auVar187 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar187 = vinsertps_avx(auVar187,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar187 = vsubps_avx(auVar187,*(undefined1 (*) [16])(prim + uVar119 * 0x19 + 6));
  auVar123._0_4_ = fVar157 * auVar187._0_4_;
  auVar123._4_4_ = fVar157 * auVar187._4_4_;
  auVar123._8_4_ = fVar157 * auVar187._8_4_;
  auVar123._12_4_ = fVar157 * auVar187._12_4_;
  auVar218._0_4_ = fVar157 * auVar19._0_4_;
  auVar218._4_4_ = fVar157 * auVar19._4_4_;
  auVar218._8_4_ = fVar157 * auVar19._8_4_;
  auVar218._12_4_ = fVar157 * auVar19._12_4_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar119 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar187);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar119 * 5 + 6);
  auVar139 = vpmovsxbd_avx2(auVar19);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar119 * 6 + 6);
  auVar135 = vpmovsxbd_avx2(auVar9);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar119 * 0xb + 6);
  auVar146 = vpmovsxbd_avx2(auVar10);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar15 * 0xc) + 6);
  auVar202 = vpmovsxbd_avx2(auVar11);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (uint)(byte)PVar15 * 0xc + uVar119 + 6);
  auVar175 = vpmovsxbd_avx2(auVar12);
  auVar175 = vcvtdq2ps_avx(auVar175);
  uVar116 = (ulong)(uint)((int)(uVar119 * 9) * 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar116 + 6);
  auVar22 = vpmovsxbd_avx2(auVar13);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar116 + uVar119 + 6);
  auVar228 = vpmovsxbd_avx2(auVar14);
  auVar228 = vcvtdq2ps_avx(auVar228);
  uVar116 = (ulong)(uint)((int)(uVar119 * 5) << 2);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar116 + 6);
  auVar198 = vpmovsxbd_avx2(auVar192);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar243._4_4_ = auVar218._0_4_;
  auVar243._0_4_ = auVar218._0_4_;
  auVar243._8_4_ = auVar218._0_4_;
  auVar243._12_4_ = auVar218._0_4_;
  auVar243._16_4_ = auVar218._0_4_;
  auVar243._20_4_ = auVar218._0_4_;
  auVar243._24_4_ = auVar218._0_4_;
  auVar243._28_4_ = auVar218._0_4_;
  auVar187 = vmovshdup_avx(auVar218);
  uVar217 = auVar187._0_8_;
  auVar252._8_8_ = uVar217;
  auVar252._0_8_ = uVar217;
  auVar252._16_8_ = uVar217;
  auVar252._24_8_ = uVar217;
  auVar187 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar157 = auVar187._0_4_;
  auVar232._0_4_ = fVar157 * auVar135._0_4_;
  fVar156 = auVar187._4_4_;
  auVar232._4_4_ = fVar156 * auVar135._4_4_;
  auVar232._8_4_ = fVar157 * auVar135._8_4_;
  auVar232._12_4_ = fVar156 * auVar135._12_4_;
  auVar232._16_4_ = fVar157 * auVar135._16_4_;
  auVar232._20_4_ = fVar156 * auVar135._20_4_;
  auVar232._28_36_ = in_ZMM12._28_36_;
  auVar232._24_4_ = fVar157 * auVar135._24_4_;
  auVar229._0_4_ = auVar175._0_4_ * fVar157;
  auVar229._4_4_ = auVar175._4_4_ * fVar156;
  auVar229._8_4_ = auVar175._8_4_ * fVar157;
  auVar229._12_4_ = auVar175._12_4_ * fVar156;
  auVar229._16_4_ = auVar175._16_4_ * fVar157;
  auVar229._20_4_ = auVar175._20_4_ * fVar156;
  auVar229._28_36_ = in_ZMM10._28_36_;
  auVar229._24_4_ = auVar175._24_4_ * fVar157;
  auVar225._0_4_ = auVar198._0_4_ * fVar157;
  auVar225._4_4_ = auVar198._4_4_ * fVar156;
  auVar225._8_4_ = auVar198._8_4_ * fVar157;
  auVar225._12_4_ = auVar198._12_4_ * fVar156;
  auVar225._16_4_ = auVar198._16_4_ * fVar157;
  auVar225._20_4_ = auVar198._20_4_ * fVar156;
  auVar225._24_4_ = auVar198._24_4_ * fVar157;
  auVar225._28_4_ = 0;
  auVar187 = vfmadd231ps_fma(auVar232._0_32_,auVar252,auVar139);
  auVar19 = vfmadd231ps_fma(auVar229._0_32_,auVar252,auVar202);
  auVar9 = vfmadd231ps_fma(auVar225,auVar228,auVar252);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar243,auVar126);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar243,auVar146);
  auVar232 = ZEXT1664(auVar19);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,auVar243);
  auVar213._4_4_ = auVar123._0_4_;
  auVar213._0_4_ = auVar123._0_4_;
  auVar213._8_4_ = auVar123._0_4_;
  auVar213._12_4_ = auVar123._0_4_;
  auVar213._16_4_ = auVar123._0_4_;
  auVar213._20_4_ = auVar123._0_4_;
  auVar213._24_4_ = auVar123._0_4_;
  auVar213._28_4_ = auVar123._0_4_;
  auVar187 = vmovshdup_avx(auVar123);
  uVar217 = auVar187._0_8_;
  auVar253._8_8_ = uVar217;
  auVar253._0_8_ = uVar217;
  auVar253._16_8_ = uVar217;
  auVar253._24_8_ = uVar217;
  auVar187 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar157 = auVar187._0_4_;
  auVar169._0_4_ = fVar157 * auVar135._0_4_;
  fVar156 = auVar187._4_4_;
  auVar169._4_4_ = fVar156 * auVar135._4_4_;
  auVar169._8_4_ = fVar157 * auVar135._8_4_;
  auVar169._12_4_ = fVar156 * auVar135._12_4_;
  auVar169._16_4_ = fVar157 * auVar135._16_4_;
  auVar169._20_4_ = fVar156 * auVar135._20_4_;
  auVar169._24_4_ = fVar157 * auVar135._24_4_;
  auVar169._28_4_ = 0;
  auVar137._4_4_ = auVar175._4_4_ * fVar156;
  auVar137._0_4_ = auVar175._0_4_ * fVar157;
  auVar137._8_4_ = auVar175._8_4_ * fVar157;
  auVar137._12_4_ = auVar175._12_4_ * fVar156;
  auVar137._16_4_ = auVar175._16_4_ * fVar157;
  auVar137._20_4_ = auVar175._20_4_ * fVar156;
  auVar137._24_4_ = auVar175._24_4_ * fVar157;
  auVar137._28_4_ = auVar135._28_4_;
  auVar135._4_4_ = auVar198._4_4_ * fVar156;
  auVar135._0_4_ = auVar198._0_4_ * fVar157;
  auVar135._8_4_ = auVar198._8_4_ * fVar157;
  auVar135._12_4_ = auVar198._12_4_ * fVar156;
  auVar135._16_4_ = auVar198._16_4_ * fVar157;
  auVar135._20_4_ = auVar198._20_4_ * fVar156;
  auVar135._24_4_ = auVar198._24_4_ * fVar157;
  auVar135._28_4_ = fVar156;
  auVar187 = vfmadd231ps_fma(auVar169,auVar253,auVar139);
  auVar11 = vfmadd231ps_fma(auVar137,auVar253,auVar202);
  auVar12 = vfmadd231ps_fma(auVar135,auVar253,auVar228);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar213,auVar126);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar213,auVar146);
  local_320._8_4_ = 0x7fffffff;
  local_320._0_8_ = 0x7fffffff7fffffff;
  local_320._12_4_ = 0x7fffffff;
  local_320._16_4_ = 0x7fffffff;
  local_320._20_4_ = 0x7fffffff;
  local_320._24_4_ = 0x7fffffff;
  local_320._28_4_ = 0x7fffffff;
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar172._16_4_ = 0x219392ef;
  auVar172._20_4_ = 0x219392ef;
  auVar172._24_4_ = 0x219392ef;
  auVar172._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar10),local_320);
  auVar126 = vcmpps_avx(auVar126,auVar172,1);
  auVar139 = vblendvps_avx(ZEXT1632(auVar10),auVar172,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar19),local_320);
  auVar126 = vcmpps_avx(auVar126,auVar172,1);
  auVar135 = vblendvps_avx(ZEXT1632(auVar19),auVar172,auVar126);
  auVar126 = vandps_avx(ZEXT1632(auVar9),local_320);
  auVar126 = vcmpps_avx(auVar126,auVar172,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar9),auVar172,auVar126);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar213,auVar22);
  auVar146 = vrcpps_avx(auVar139);
  auVar141._8_4_ = 0x3f800000;
  auVar141._0_8_ = &DAT_3f8000003f800000;
  auVar141._12_4_ = 0x3f800000;
  auVar141._16_4_ = 0x3f800000;
  auVar141._20_4_ = 0x3f800000;
  auVar141._24_4_ = 0x3f800000;
  auVar141._28_4_ = 0x3f800000;
  auVar187 = vfnmadd213ps_fma(auVar139,auVar146,auVar141);
  auVar187 = vfmadd132ps_fma(ZEXT1632(auVar187),auVar146,auVar146);
  auVar139 = vrcpps_avx(auVar135);
  auVar19 = vfnmadd213ps_fma(auVar135,auVar139,auVar141);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar139,auVar139);
  auVar139 = vrcpps_avx(auVar126);
  auVar9 = vfnmadd213ps_fma(auVar126,auVar139,auVar141);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar139,auVar139);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar119 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar13));
  auVar146._4_4_ = auVar187._4_4_ * auVar126._4_4_;
  auVar146._0_4_ = auVar187._0_4_ * auVar126._0_4_;
  auVar146._8_4_ = auVar187._8_4_ * auVar126._8_4_;
  auVar146._12_4_ = auVar187._12_4_ * auVar126._12_4_;
  auVar146._16_4_ = auVar126._16_4_ * 0.0;
  auVar146._20_4_ = auVar126._20_4_ * 0.0;
  auVar146._24_4_ = auVar126._24_4_ * 0.0;
  auVar146._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar119 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar13));
  auVar202._4_4_ = auVar187._4_4_ * auVar126._4_4_;
  auVar202._0_4_ = auVar187._0_4_ * auVar126._0_4_;
  auVar202._8_4_ = auVar187._8_4_ * auVar126._8_4_;
  auVar202._12_4_ = auVar187._12_4_ * auVar126._12_4_;
  auVar202._16_4_ = auVar126._16_4_ * 0.0;
  auVar202._20_4_ = auVar126._20_4_ * 0.0;
  auVar202._24_4_ = auVar126._24_4_ * 0.0;
  auVar202._28_4_ = auVar126._28_4_;
  auVar149._1_3_ = 0;
  auVar149[0] = PVar15;
  auVar139 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar15 * 0x10 + 6));
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar15 * 0x10 + uVar119 * -2 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar11));
  auVar175._4_4_ = auVar126._4_4_ * auVar19._4_4_;
  auVar175._0_4_ = auVar126._0_4_ * auVar19._0_4_;
  auVar175._8_4_ = auVar126._8_4_ * auVar19._8_4_;
  auVar175._12_4_ = auVar126._12_4_ * auVar19._12_4_;
  auVar175._16_4_ = auVar126._16_4_ * 0.0;
  auVar175._20_4_ = auVar126._20_4_ * 0.0;
  auVar175._24_4_ = auVar126._24_4_ * 0.0;
  auVar175._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar139);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar11));
  auVar22._4_4_ = auVar19._4_4_ * auVar126._4_4_;
  auVar22._0_4_ = auVar19._0_4_ * auVar126._0_4_;
  auVar22._8_4_ = auVar19._8_4_ * auVar126._8_4_;
  auVar22._12_4_ = auVar19._12_4_ * auVar126._12_4_;
  auVar22._16_4_ = auVar126._16_4_ * 0.0;
  auVar22._20_4_ = auVar126._20_4_ * 0.0;
  auVar22._24_4_ = auVar126._24_4_ * 0.0;
  auVar22._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar116 + uVar119 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar10));
  auVar228._4_4_ = auVar126._4_4_ * auVar9._4_4_;
  auVar228._0_4_ = auVar126._0_4_ * auVar9._0_4_;
  auVar228._8_4_ = auVar126._8_4_ * auVar9._8_4_;
  auVar228._12_4_ = auVar126._12_4_ * auVar9._12_4_;
  auVar228._16_4_ = auVar126._16_4_ * 0.0;
  auVar228._20_4_ = auVar126._20_4_ * 0.0;
  auVar228._24_4_ = auVar126._24_4_ * 0.0;
  auVar228._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar119 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar10));
  auVar198._4_4_ = auVar9._4_4_ * auVar126._4_4_;
  auVar198._0_4_ = auVar9._0_4_ * auVar126._0_4_;
  auVar198._8_4_ = auVar9._8_4_ * auVar126._8_4_;
  auVar198._12_4_ = auVar9._12_4_ * auVar126._12_4_;
  auVar198._16_4_ = auVar126._16_4_ * 0.0;
  auVar198._20_4_ = auVar126._20_4_ * 0.0;
  auVar198._24_4_ = auVar126._24_4_ * 0.0;
  auVar198._28_4_ = auVar126._28_4_;
  auVar126 = vpminsd_avx2(auVar146,auVar202);
  auVar139 = vpminsd_avx2(auVar175,auVar22);
  auVar126 = vmaxps_avx(auVar126,auVar139);
  uVar121 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar174._4_4_ = uVar121;
  auVar174._0_4_ = uVar121;
  auVar174._8_4_ = uVar121;
  auVar174._12_4_ = uVar121;
  auVar174._16_4_ = uVar121;
  auVar174._20_4_ = uVar121;
  auVar174._24_4_ = uVar121;
  auVar174._28_4_ = uVar121;
  auVar139 = vpminsd_avx2(auVar228,auVar198);
  auVar139 = vmaxps_avx(auVar139,auVar174);
  auVar229 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar126 = vmaxps_avx(auVar126,auVar139);
  local_80._4_4_ = auVar126._4_4_ * 0.99999964;
  local_80._0_4_ = auVar126._0_4_ * 0.99999964;
  local_80._8_4_ = auVar126._8_4_ * 0.99999964;
  local_80._12_4_ = auVar126._12_4_ * 0.99999964;
  local_80._16_4_ = auVar126._16_4_ * 0.99999964;
  local_80._20_4_ = auVar126._20_4_ * 0.99999964;
  local_80._24_4_ = auVar126._24_4_ * 0.99999964;
  local_80._28_4_ = auVar139._28_4_;
  auVar126 = vpmaxsd_avx2(auVar146,auVar202);
  auVar139 = vpmaxsd_avx2(auVar175,auVar22);
  auVar126 = vminps_avx(auVar126,auVar139);
  auVar139 = vpmaxsd_avx2(auVar228,auVar198);
  uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar128._4_4_ = uVar121;
  auVar128._0_4_ = uVar121;
  auVar128._8_4_ = uVar121;
  auVar128._12_4_ = uVar121;
  auVar128._16_4_ = uVar121;
  auVar128._20_4_ = uVar121;
  auVar128._24_4_ = uVar121;
  auVar128._28_4_ = uVar121;
  auVar139 = vminps_avx(auVar139,auVar128);
  auVar126 = vminps_avx(auVar126,auVar139);
  auVar21._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar126._28_4_;
  auVar149[4] = PVar15;
  auVar149._5_3_ = 0;
  auVar149[8] = PVar15;
  auVar149._9_3_ = 0;
  auVar149[0xc] = PVar15;
  auVar149._13_3_ = 0;
  auVar149[0x10] = PVar15;
  auVar149._17_3_ = 0;
  auVar149[0x14] = PVar15;
  auVar149._21_3_ = 0;
  auVar149[0x18] = PVar15;
  auVar149._25_3_ = 0;
  auVar149[0x1c] = PVar15;
  auVar149._29_3_ = 0;
  auVar139 = vpcmpgtd_avx2(auVar149,_DAT_0205a920);
  auVar126 = vcmpps_avx(local_80,auVar21,2);
  auVar126 = vandps_avx(auVar126,auVar139);
  uVar113 = vmovmskps_avx(auVar126);
  if (uVar113 != 0) {
    uVar113 = uVar113 & 0xff;
    local_628 = pre->ray_space + k;
    local_620 = mm_lookupmask_ps._16_8_;
    uStack_618 = mm_lookupmask_ps._24_8_;
    uStack_610 = mm_lookupmask_ps._16_8_;
    uStack_608 = mm_lookupmask_ps._24_8_;
    local_748 = (undefined1 (*) [32])&local_200;
    iVar114 = 1 << ((uint)k & 0x1f);
    auVar126._4_4_ = iVar114;
    auVar126._0_4_ = iVar114;
    auVar126._8_4_ = iVar114;
    auVar126._12_4_ = iVar114;
    auVar126._16_4_ = iVar114;
    auVar126._20_4_ = iVar114;
    auVar126._24_4_ = iVar114;
    auVar126._28_4_ = iVar114;
    auVar139 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar126 = vpand_avx2(auVar126,auVar139);
    local_340 = vpcmpeqd_avx2(auVar126,auVar139);
    local_350 = 0x7fffffff;
    uStack_34c = 0x7fffffff;
    uStack_348 = 0x7fffffff;
    uStack_344 = 0x7fffffff;
    do {
      auVar126 = local_540;
      auVar139 = auVar229._0_32_;
      auVar135 = auVar232._0_32_;
      lVar23 = 0;
      uVar119 = (ulong)uVar113;
      for (uVar116 = uVar119; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar113 = *(uint *)(prim + 2);
      uVar16 = *(uint *)(prim + lVar23 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar113].ptr;
      uVar116 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar16);
      p_Var18 = pGVar17[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar17[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var18 * uVar116);
      uVar217 = *(undefined8 *)*pauVar1;
      uVar98 = *(undefined8 *)(*pauVar1 + 8);
      auVar14 = *pauVar1;
      auVar10 = *pauVar1;
      auVar187 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar116 + 1) * (long)p_Var18);
      uVar99 = *(undefined8 *)*pauVar2;
      uVar100 = *(undefined8 *)(*pauVar2 + 8);
      auVar11 = *pauVar2;
      auVar9 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar116 + 2) * (long)p_Var18);
      uVar101 = *(undefined8 *)*pauVar3;
      uVar102 = *(undefined8 *)(*pauVar3 + 8);
      auVar12 = *pauVar3;
      auVar19 = *pauVar3;
      uVar119 = uVar119 - 1 & uVar119;
      pauVar4 = (undefined1 (*) [16])(lVar23 + (uVar116 + 3) * (long)p_Var18);
      uVar103 = *(undefined8 *)*pauVar4;
      uVar104 = *(undefined8 *)(*pauVar4 + 8);
      auVar13 = *pauVar4;
      local_820 = (float)uVar103;
      fStack_81c = (float)((ulong)uVar103 >> 0x20);
      fStack_818 = (float)uVar104;
      fStack_814 = (float)((ulong)uVar104 >> 0x20);
      if (uVar119 != 0) {
        uVar118 = uVar119 - 1 & uVar119;
        for (uVar116 = uVar119; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x8000000000000000) {
        }
        if (uVar118 != 0) {
          for (; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar114 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar192 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar20 = vinsertps_avx(auVar192,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar123 = vsubps_avx(*pauVar1,auVar20);
      uVar121 = auVar123._0_4_;
      auVar184._4_4_ = uVar121;
      auVar184._0_4_ = uVar121;
      auVar184._8_4_ = uVar121;
      auVar184._12_4_ = uVar121;
      auVar192 = vshufps_avx(auVar123,auVar123,0x55);
      auVar123 = vshufps_avx(auVar123,auVar123,0xaa);
      aVar7 = (local_628->vx).field_0;
      aVar8 = (local_628->vy).field_0;
      fVar157 = (local_628->vz).field_0.m128[0];
      fVar156 = *(float *)((long)&(local_628->vz).field_0 + 4);
      fVar203 = *(float *)((long)&(local_628->vz).field_0 + 8);
      fVar204 = *(float *)((long)&(local_628->vz).field_0 + 0xc);
      auVar209._0_4_ = fVar157 * auVar123._0_4_;
      auVar209._4_4_ = fVar156 * auVar123._4_4_;
      auVar209._8_4_ = fVar203 * auVar123._8_4_;
      auVar209._12_4_ = fVar204 * auVar123._12_4_;
      auVar192 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar8,auVar192);
      auVar209 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar184);
      auVar192 = vblendps_avx(auVar209,*pauVar1,8);
      auVar218 = vsubps_avx(*pauVar2,auVar20);
      uVar121 = auVar218._0_4_;
      auVar210._4_4_ = uVar121;
      auVar210._0_4_ = uVar121;
      auVar210._8_4_ = uVar121;
      auVar210._12_4_ = uVar121;
      auVar123 = vshufps_avx(auVar218,auVar218,0x55);
      auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
      auVar230._0_4_ = fVar157 * auVar218._0_4_;
      auVar230._4_4_ = fVar156 * auVar218._4_4_;
      auVar230._8_4_ = fVar203 * auVar218._8_4_;
      auVar230._12_4_ = fVar204 * auVar218._12_4_;
      auVar123 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar8,auVar123);
      auVar210 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar7,auVar210);
      auVar123 = vblendps_avx(auVar210,*pauVar2,8);
      auVar184 = vsubps_avx(*pauVar3,auVar20);
      uVar121 = auVar184._0_4_;
      auVar219._4_4_ = uVar121;
      auVar219._0_4_ = uVar121;
      auVar219._8_4_ = uVar121;
      auVar219._12_4_ = uVar121;
      auVar218 = vshufps_avx(auVar184,auVar184,0x55);
      auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
      auVar234._0_4_ = fVar157 * auVar184._0_4_;
      auVar234._4_4_ = fVar156 * auVar184._4_4_;
      auVar234._8_4_ = fVar203 * auVar184._8_4_;
      auVar234._12_4_ = fVar204 * auVar184._12_4_;
      auVar218 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar8,auVar218);
      auVar219 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar219);
      auVar218 = vblendps_avx(auVar219,*pauVar3,8);
      auVar24._12_4_ = fStack_814;
      auVar24._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar184 = vsubps_avx(auVar24,auVar20);
      uVar121 = auVar184._0_4_;
      auVar220._4_4_ = uVar121;
      auVar220._0_4_ = uVar121;
      auVar220._8_4_ = uVar121;
      auVar220._12_4_ = uVar121;
      auVar20 = vshufps_avx(auVar184,auVar184,0x55);
      auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
      auVar236._0_4_ = fVar157 * auVar184._0_4_;
      auVar236._4_4_ = fVar156 * auVar184._4_4_;
      auVar236._8_4_ = fVar203 * auVar184._8_4_;
      auVar236._12_4_ = fVar204 * auVar184._12_4_;
      auVar20 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar8,auVar20);
      auVar220 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar220);
      auVar20 = vblendps_avx(auVar220,auVar24,8);
      auVar25._4_4_ = uStack_34c;
      auVar25._0_4_ = local_350;
      auVar25._8_4_ = uStack_348;
      auVar25._12_4_ = uStack_344;
      auVar192 = vandps_avx(auVar192,auVar25);
      auVar123 = vandps_avx(auVar123,auVar25);
      auVar184 = vmaxps_avx(auVar192,auVar123);
      auVar192 = vandps_avx(auVar218,auVar25);
      auVar123 = vandps_avx(auVar20,auVar25);
      auVar192 = vmaxps_avx(auVar192,auVar123);
      auVar192 = vmaxps_avx(auVar184,auVar192);
      auVar123 = vmovshdup_avx(auVar192);
      auVar123 = vmaxss_avx(auVar123,auVar192);
      auVar192 = vshufpd_avx(auVar192,auVar192,1);
      auVar192 = vmaxss_avx(auVar192,auVar123);
      lVar23 = (long)iVar114 * 0x44;
      auVar123 = vmovshdup_avx(auVar209);
      uVar122 = auVar123._0_8_;
      local_6a0._8_8_ = uVar122;
      local_6a0._0_8_ = uVar122;
      local_6a0._16_8_ = uVar122;
      local_6a0._24_8_ = uVar122;
      auVar146 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      auVar123 = vmovshdup_avx(auVar210);
      uVar122 = auVar123._0_8_;
      local_720._8_8_ = uVar122;
      local_720._0_8_ = uVar122;
      local_720._16_8_ = uVar122;
      local_720._24_8_ = uVar122;
      auVar202 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      uVar233 = auVar219._0_4_;
      auVar168._4_4_ = uVar233;
      auVar168._0_4_ = uVar233;
      auVar168._8_4_ = uVar233;
      auVar168._12_4_ = uVar233;
      auVar168._16_4_ = uVar233;
      auVar168._20_4_ = uVar233;
      auVar168._24_4_ = uVar233;
      auVar168._28_4_ = uVar233;
      auVar123 = vmovshdup_avx(auVar219);
      uVar122 = auVar123._0_8_;
      auVar196._8_8_ = uVar122;
      auVar196._0_8_ = uVar122;
      auVar196._16_8_ = uVar122;
      auVar196._24_8_ = uVar122;
      fVar156 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      fVar203 = *(float *)(bspline_basis0 + lVar23 + 0xd90);
      fVar204 = *(float *)(bspline_basis0 + lVar23 + 0xd94);
      fVar205 = *(float *)(bspline_basis0 + lVar23 + 0xd98);
      fVar206 = *(float *)(bspline_basis0 + lVar23 + 0xd9c);
      fVar207 = *(float *)(bspline_basis0 + lVar23 + 0xda0);
      fVar208 = *(float *)(bspline_basis0 + lVar23 + 0xda4);
      auVar111 = *(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      local_7a0 = auVar220._0_4_;
      auVar123 = vmovshdup_avx(auVar220);
      auVar211._0_4_ = fVar156 * local_7a0;
      auVar211._4_4_ = fVar203 * local_7a0;
      auVar211._8_4_ = fVar204 * local_7a0;
      auVar211._12_4_ = fVar205 * local_7a0;
      auVar211._16_4_ = fVar206 * local_7a0;
      auVar211._20_4_ = fVar207 * local_7a0;
      auVar211._24_4_ = fVar208 * local_7a0;
      auVar211._28_4_ = 0;
      fVar242 = auVar123._0_4_;
      auVar127._0_4_ = fVar242 * fVar156;
      fVar246 = auVar123._4_4_;
      auVar127._4_4_ = fVar246 * fVar203;
      auVar127._8_4_ = fVar242 * fVar204;
      auVar127._12_4_ = fVar246 * fVar205;
      auVar127._16_4_ = fVar242 * fVar206;
      auVar127._20_4_ = fVar246 * fVar207;
      auVar127._24_4_ = fVar242 * fVar208;
      auVar127._28_4_ = 0;
      auVar123 = vfmadd231ps_fma(auVar211,auVar202,auVar168);
      auVar218 = vfmadd231ps_fma(auVar127,auVar202,auVar196);
      uVar121 = auVar210._0_4_;
      local_7c0._4_4_ = uVar121;
      local_7c0._0_4_ = uVar121;
      local_7c0._8_4_ = uVar121;
      local_7c0._12_4_ = uVar121;
      local_7c0._16_4_ = uVar121;
      local_7c0._20_4_ = uVar121;
      local_7c0._24_4_ = uVar121;
      local_7c0._28_4_ = uVar121;
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar146,local_7c0);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar146,local_720);
      auVar175 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar121 = auVar209._0_4_;
      local_780._4_4_ = uVar121;
      local_780._0_4_ = uVar121;
      local_780._8_4_ = uVar121;
      local_780._12_4_ = uVar121;
      local_780._16_4_ = uVar121;
      local_780._20_4_ = uVar121;
      local_780._24_4_ = uVar121;
      local_780._28_4_ = uVar121;
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar175,local_780);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar175,local_6a0);
      auVar22 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      fVar91 = *(float *)(bspline_basis1 + lVar23 + 0xd8c);
      fVar92 = *(float *)(bspline_basis1 + lVar23 + 0xd90);
      fVar93 = *(float *)(bspline_basis1 + lVar23 + 0xd94);
      fVar94 = *(float *)(bspline_basis1 + lVar23 + 0xd98);
      fVar95 = *(float *)(bspline_basis1 + lVar23 + 0xd9c);
      fVar96 = *(float *)(bspline_basis1 + lVar23 + 0xda0);
      fVar97 = *(float *)(bspline_basis1 + lVar23 + 0xda4);
      auVar26._4_4_ = fVar92 * local_7a0;
      auVar26._0_4_ = fVar91 * local_7a0;
      auVar26._8_4_ = fVar93 * local_7a0;
      auVar26._12_4_ = fVar94 * local_7a0;
      auVar26._16_4_ = fVar95 * local_7a0;
      auVar26._20_4_ = fVar96 * local_7a0;
      auVar26._24_4_ = fVar97 * local_7a0;
      auVar26._28_4_ = local_7a0;
      auVar20 = vfmadd231ps_fma(auVar26,auVar22,auVar168);
      auVar27._4_4_ = fVar246 * fVar92;
      auVar27._0_4_ = fVar242 * fVar91;
      auVar27._8_4_ = fVar242 * fVar93;
      auVar27._12_4_ = fVar246 * fVar94;
      auVar27._16_4_ = fVar242 * fVar95;
      auVar27._20_4_ = fVar246 * fVar96;
      auVar27._24_4_ = fVar242 * fVar97;
      auVar27._28_4_ = uVar233;
      auVar184 = vfmadd231ps_fma(auVar27,auVar22,auVar196);
      auVar228 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar228,local_7c0);
      auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar228,local_720);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar198,local_780);
      auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar198,local_6a0);
      auVar141 = ZEXT1632(auVar20);
      local_380 = ZEXT1632(auVar123);
      auVar21 = vsubps_avx(auVar141,local_380);
      auVar169 = ZEXT1632(auVar184);
      auVar128 = ZEXT1632(auVar218);
      auVar149 = vsubps_avx(auVar169,auVar128);
      auVar129._0_4_ = auVar218._0_4_ * auVar21._0_4_;
      auVar129._4_4_ = auVar218._4_4_ * auVar21._4_4_;
      auVar129._8_4_ = auVar218._8_4_ * auVar21._8_4_;
      auVar129._12_4_ = auVar218._12_4_ * auVar21._12_4_;
      auVar129._16_4_ = auVar21._16_4_ * 0.0;
      auVar129._20_4_ = auVar21._20_4_ * 0.0;
      auVar129._24_4_ = auVar21._24_4_ * 0.0;
      auVar129._28_4_ = 0;
      fVar235 = auVar149._0_4_;
      auVar142._0_4_ = fVar235 * auVar123._0_4_;
      fVar241 = auVar149._4_4_;
      auVar142._4_4_ = fVar241 * auVar123._4_4_;
      fVar247 = auVar149._8_4_;
      auVar142._8_4_ = fVar247 * auVar123._8_4_;
      fVar248 = auVar149._12_4_;
      auVar142._12_4_ = fVar248 * auVar123._12_4_;
      fVar249 = auVar149._16_4_;
      auVar142._16_4_ = fVar249 * 0.0;
      fVar250 = auVar149._20_4_;
      auVar142._20_4_ = fVar250 * 0.0;
      fVar251 = auVar149._24_4_;
      auVar142._24_4_ = fVar251 * 0.0;
      auVar142._28_4_ = 0;
      auVar172 = vsubps_avx(auVar129,auVar142);
      auVar123 = vpermilps_avx(*pauVar1,0xff);
      uVar122 = auVar123._0_8_;
      local_a0._8_8_ = uVar122;
      local_a0._0_8_ = uVar122;
      local_a0._16_8_ = uVar122;
      local_a0._24_8_ = uVar122;
      auVar218 = vpermilps_avx(*pauVar2,0xff);
      uVar122 = auVar218._0_8_;
      local_c0._8_8_ = uVar122;
      local_c0._0_8_ = uVar122;
      local_c0._16_8_ = uVar122;
      local_c0._24_8_ = uVar122;
      auVar218 = vpermilps_avx(*pauVar3,0xff);
      uVar122 = auVar218._0_8_;
      local_e0._8_8_ = uVar122;
      local_e0._0_8_ = uVar122;
      local_e0._16_8_ = uVar122;
      local_e0._24_8_ = uVar122;
      auVar20._12_4_ = fStack_814;
      auVar20._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar218 = vpermilps_avx(auVar20,0xff);
      local_100 = auVar218._0_8_;
      fVar157 = auVar218._0_4_;
      auVar212._0_4_ = fVar156 * fVar157;
      fVar156 = auVar218._4_4_;
      auVar212._4_4_ = fVar203 * fVar156;
      auVar212._8_4_ = fVar204 * fVar157;
      auVar212._12_4_ = fVar205 * fVar156;
      auVar212._16_4_ = fVar206 * fVar157;
      auVar212._20_4_ = fVar207 * fVar156;
      auVar212._24_4_ = fVar208 * fVar157;
      auVar212._28_4_ = 0;
      auVar218 = vfmadd231ps_fma(auVar212,local_e0,auVar202);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),local_c0,auVar146);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar175,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar28._4_4_ = fVar92 * fVar156;
      auVar28._0_4_ = fVar91 * fVar157;
      auVar28._8_4_ = fVar93 * fVar157;
      auVar28._12_4_ = fVar94 * fVar156;
      auVar28._16_4_ = fVar95 * fVar157;
      auVar28._20_4_ = fVar96 * fVar156;
      auVar28._24_4_ = fVar97 * fVar157;
      auVar28._28_4_ = auVar175._28_4_;
      auVar218 = vfmadd231ps_fma(auVar28,auVar22,local_e0);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar228,local_c0);
      auVar184 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar198,local_a0);
      auVar29._4_4_ = fVar241 * fVar241;
      auVar29._0_4_ = fVar235 * fVar235;
      auVar29._8_4_ = fVar247 * fVar247;
      auVar29._12_4_ = fVar248 * fVar248;
      auVar29._16_4_ = fVar249 * fVar249;
      auVar29._20_4_ = fVar250 * fVar250;
      auVar29._24_4_ = fVar251 * fVar251;
      auVar29._28_4_ = auVar123._4_4_;
      auVar123 = vfmadd231ps_fma(auVar29,auVar21,auVar21);
      auVar137 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar184));
      auVar30._4_4_ = auVar137._4_4_ * auVar137._4_4_ * auVar123._4_4_;
      auVar30._0_4_ = auVar137._0_4_ * auVar137._0_4_ * auVar123._0_4_;
      auVar30._8_4_ = auVar137._8_4_ * auVar137._8_4_ * auVar123._8_4_;
      auVar30._12_4_ = auVar137._12_4_ * auVar137._12_4_ * auVar123._12_4_;
      auVar30._16_4_ = auVar137._16_4_ * auVar137._16_4_ * 0.0;
      auVar30._20_4_ = auVar137._20_4_ * auVar137._20_4_ * 0.0;
      auVar30._24_4_ = auVar137._24_4_ * auVar137._24_4_ * 0.0;
      auVar30._28_4_ = auVar137._28_4_;
      auVar31._4_4_ = auVar172._4_4_ * auVar172._4_4_;
      auVar31._0_4_ = auVar172._0_4_ * auVar172._0_4_;
      auVar31._8_4_ = auVar172._8_4_ * auVar172._8_4_;
      auVar31._12_4_ = auVar172._12_4_ * auVar172._12_4_;
      auVar31._16_4_ = auVar172._16_4_ * auVar172._16_4_;
      auVar31._20_4_ = auVar172._20_4_ * auVar172._20_4_;
      auVar31._24_4_ = auVar172._24_4_ * auVar172._24_4_;
      auVar31._28_4_ = auVar172._28_4_;
      auVar137 = vcmpps_avx(auVar31,auVar30,2);
      auVar179 = ZEXT3264(auVar137);
      fVar157 = auVar192._0_4_ * 4.7683716e-07;
      auVar130._0_4_ = (float)iVar114;
      local_540._4_12_ = auVar219._4_12_;
      local_540._0_4_ = auVar130._0_4_;
      local_540._16_16_ = auVar126._16_16_;
      auVar130._4_4_ = auVar130._0_4_;
      auVar130._8_4_ = auVar130._0_4_;
      auVar130._12_4_ = auVar130._0_4_;
      auVar130._16_4_ = auVar130._0_4_;
      auVar130._20_4_ = auVar130._0_4_;
      auVar130._24_4_ = auVar130._0_4_;
      auVar130._28_4_ = auVar130._0_4_;
      auVar126 = vcmpps_avx(_DAT_02020f40,auVar130,1);
      auVar123 = vpermilps_avx(auVar209,0xaa);
      uVar122 = auVar123._0_8_;
      local_5a0._8_8_ = uVar122;
      local_5a0._0_8_ = uVar122;
      local_5a0._16_8_ = uVar122;
      local_5a0._24_8_ = uVar122;
      auVar218 = vpermilps_avx(auVar210,0xaa);
      uVar122 = auVar218._0_8_;
      local_580._8_8_ = uVar122;
      local_580._0_8_ = uVar122;
      local_580._16_8_ = uVar122;
      local_580._24_8_ = uVar122;
      auVar192 = vshufps_avx(auVar219,auVar219,0xaa);
      uVar122 = auVar192._0_8_;
      local_300._8_8_ = uVar122;
      local_300._0_8_ = uVar122;
      local_300._16_8_ = uVar122;
      local_300._24_8_ = uVar122;
      auVar192 = vshufps_avx(auVar220,auVar220,0xaa);
      uVar122 = auVar192._0_8_;
      register0x00001508 = uVar122;
      local_700 = uVar122;
      register0x00001510 = uVar122;
      register0x00001518 = uVar122;
      auVar239 = ZEXT3264(_local_700);
      auVar172 = auVar126 & auVar137;
      uVar117 = *(uint *)(ray + k * 4 + 0x60);
      local_740._0_16_ = ZEXT416(uVar117);
      fStack_79c = local_7a0;
      fStack_798 = local_7a0;
      fStack_794 = local_7a0;
      fStack_790 = local_7a0;
      fStack_78c = local_7a0;
      fStack_788 = local_7a0;
      fStack_784 = local_7a0;
      if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0x7f,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar172 >> 0xbf,0) == '\0') &&
          (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar172[0x1f]) {
        auVar232 = ZEXT3264(auVar135);
        auVar229 = ZEXT3264(auVar139);
        auVar155 = ZEXT3264(local_720);
        auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                      CONCAT424(local_7a0,
                                                CONCAT420(local_7a0,
                                                          CONCAT416(local_7a0,
                                                                    CONCAT412(local_7a0,
                                                                              CONCAT48(local_7a0,
                                                                                       CONCAT44(
                                                  local_7a0,local_7a0))))))));
        auVar224 = ZEXT3264(local_7c0);
        auVar216 = ZEXT3264(local_780);
      }
      else {
        local_3a0 = vandps_avx(auVar137,auVar126);
        fVar235 = auVar192._0_4_;
        fVar241 = auVar192._4_4_;
        auVar32._4_4_ = fVar241 * fVar92;
        auVar32._0_4_ = fVar235 * fVar91;
        auVar32._8_4_ = fVar235 * fVar93;
        auVar32._12_4_ = fVar241 * fVar94;
        auVar32._16_4_ = fVar235 * fVar95;
        auVar32._20_4_ = fVar241 * fVar96;
        auVar32._24_4_ = fVar235 * fVar97;
        auVar32._28_4_ = local_3a0._28_4_;
        auVar192 = vfmadd213ps_fma(auVar22,local_300,auVar32);
        auVar192 = vfmadd213ps_fma(auVar228,local_580,ZEXT1632(auVar192));
        auVar192 = vfmadd213ps_fma(auVar198,local_5a0,ZEXT1632(auVar192));
        local_600._0_4_ = auVar111._0_4_;
        local_600._4_4_ = auVar111._4_4_;
        fStack_5f8 = auVar111._8_4_;
        fStack_5f4 = auVar111._12_4_;
        fStack_5f0 = auVar111._16_4_;
        fStack_5ec = auVar111._20_4_;
        fStack_5e8 = auVar111._24_4_;
        auVar131._0_4_ = fVar235 * (float)local_600._0_4_;
        auVar131._4_4_ = fVar241 * (float)local_600._4_4_;
        auVar131._8_4_ = fVar235 * fStack_5f8;
        auVar131._12_4_ = fVar241 * fStack_5f4;
        auVar131._16_4_ = fVar235 * fStack_5f0;
        auVar131._20_4_ = fVar241 * fStack_5ec;
        auVar131._24_4_ = fVar235 * fStack_5e8;
        auVar131._28_4_ = 0;
        auVar209 = vfmadd213ps_fma(auVar202,local_300,auVar131);
        auVar209 = vfmadd213ps_fma(auVar146,local_580,ZEXT1632(auVar209));
        auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar146 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar202 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        fVar156 = *(float *)(bspline_basis0 + lVar23 + 0x1f9c);
        fVar203 = *(float *)(bspline_basis0 + lVar23 + 0x1fa0);
        fVar204 = *(float *)(bspline_basis0 + lVar23 + 0x1fa4);
        fVar205 = *(float *)(bspline_basis0 + lVar23 + 0x1fa8);
        fVar206 = *(float *)(bspline_basis0 + lVar23 + 0x1fac);
        fVar207 = *(float *)(bspline_basis0 + lVar23 + 0x1fb0);
        fVar208 = *(float *)(bspline_basis0 + lVar23 + 0x1fb4);
        auVar197._0_4_ = local_7a0 * fVar156;
        auVar197._4_4_ = local_7a0 * fVar203;
        auVar197._8_4_ = local_7a0 * fVar204;
        auVar197._12_4_ = local_7a0 * fVar205;
        auVar197._16_4_ = local_7a0 * fVar206;
        auVar197._20_4_ = local_7a0 * fVar207;
        auVar197._24_4_ = local_7a0 * fVar208;
        auVar197._28_4_ = 0;
        auVar33._4_4_ = fVar246 * fVar203;
        auVar33._0_4_ = fVar242 * fVar156;
        auVar33._8_4_ = fVar242 * fVar204;
        auVar33._12_4_ = fVar246 * fVar205;
        auVar33._16_4_ = fVar242 * fVar206;
        auVar33._20_4_ = fVar246 * fVar207;
        auVar33._24_4_ = fVar242 * fVar208;
        auVar33._28_4_ = auVar218._4_4_;
        auVar34._4_4_ = fVar241 * fVar203;
        auVar34._0_4_ = fVar235 * fVar156;
        auVar34._8_4_ = fVar235 * fVar204;
        auVar34._12_4_ = fVar241 * fVar205;
        auVar34._16_4_ = fVar235 * fVar206;
        auVar34._20_4_ = fVar241 * fVar207;
        auVar34._24_4_ = fVar235 * fVar208;
        auVar34._28_4_ = fVar241;
        auVar218 = vfmadd231ps_fma(auVar197,auVar202,auVar168);
        auVar210 = vfmadd231ps_fma(auVar33,auVar202,auVar196);
        auVar219 = vfmadd231ps_fma(auVar34,local_300,auVar202);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar146,local_7c0);
        auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar146,local_720);
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar146,local_580);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar126,local_780);
        auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar126,local_6a0);
        auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_5a0,auVar126);
        fVar156 = *(float *)(bspline_basis1 + lVar23 + 0x1f9c);
        fVar203 = *(float *)(bspline_basis1 + lVar23 + 0x1fa0);
        fVar204 = *(float *)(bspline_basis1 + lVar23 + 0x1fa4);
        fVar205 = *(float *)(bspline_basis1 + lVar23 + 0x1fa8);
        fVar206 = *(float *)(bspline_basis1 + lVar23 + 0x1fac);
        fVar207 = *(float *)(bspline_basis1 + lVar23 + 0x1fb0);
        fVar208 = *(float *)(bspline_basis1 + lVar23 + 0x1fb4);
        auVar35._4_4_ = local_7a0 * fVar203;
        auVar35._0_4_ = local_7a0 * fVar156;
        auVar35._8_4_ = local_7a0 * fVar204;
        auVar35._12_4_ = local_7a0 * fVar205;
        auVar35._16_4_ = local_7a0 * fVar206;
        auVar35._20_4_ = local_7a0 * fVar207;
        auVar35._24_4_ = local_7a0 * fVar208;
        auVar35._28_4_ = auVar126._28_4_;
        auVar36._4_4_ = fVar246 * fVar203;
        auVar36._0_4_ = fVar242 * fVar156;
        auVar36._8_4_ = fVar242 * fVar204;
        auVar36._12_4_ = fVar246 * fVar205;
        auVar36._16_4_ = fVar242 * fVar206;
        auVar36._20_4_ = fVar246 * fVar207;
        auVar36._24_4_ = fVar242 * fVar208;
        auVar36._28_4_ = fVar246;
        auVar37._4_4_ = fVar203 * fVar241;
        auVar37._0_4_ = fVar156 * fVar235;
        auVar37._8_4_ = fVar204 * fVar235;
        auVar37._12_4_ = fVar205 * fVar241;
        auVar37._16_4_ = fVar206 * fVar235;
        auVar37._20_4_ = fVar207 * fVar241;
        auVar37._24_4_ = fVar208 * fVar235;
        auVar37._28_4_ = auVar123._4_4_;
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar123 = vfmadd231ps_fma(auVar35,auVar126,auVar168);
        auVar220 = vfmadd231ps_fma(auVar36,auVar126,auVar196);
        auVar24 = vfmadd231ps_fma(auVar37,auVar126,local_300);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar126,local_7c0);
        auVar220 = vfmadd231ps_fma(ZEXT1632(auVar220),auVar126,local_720);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_580,auVar126);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar126,local_780);
        auVar220 = vfmadd231ps_fma(ZEXT1632(auVar220),auVar126,local_6a0);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_5a0,auVar126);
        auVar126 = vandps_avx(local_320,ZEXT1632(auVar218));
        auVar146 = vandps_avx(ZEXT1632(auVar210),local_320);
        auVar146 = vmaxps_avx(auVar126,auVar146);
        auVar126 = vandps_avx(ZEXT1632(auVar219),local_320);
        auVar126 = vmaxps_avx(auVar146,auVar126);
        auVar143._4_4_ = fVar157;
        auVar143._0_4_ = fVar157;
        auVar143._8_4_ = fVar157;
        auVar143._12_4_ = fVar157;
        auVar143._16_4_ = fVar157;
        auVar143._20_4_ = fVar157;
        auVar143._24_4_ = fVar157;
        auVar143._28_4_ = fVar157;
        auVar126 = vcmpps_avx(auVar126,auVar143,1);
        auVar202 = vblendvps_avx(ZEXT1632(auVar218),auVar21,auVar126);
        auVar22 = vblendvps_avx(ZEXT1632(auVar210),auVar149,auVar126);
        auVar126 = vandps_avx(ZEXT1632(auVar123),local_320);
        auVar146 = vandps_avx(ZEXT1632(auVar220),local_320);
        auVar146 = vmaxps_avx(auVar126,auVar146);
        auVar126 = vandps_avx(ZEXT1632(auVar24),local_320);
        auVar126 = vmaxps_avx(auVar146,auVar126);
        auVar146 = vcmpps_avx(auVar126,auVar143,1);
        auVar126 = vblendvps_avx(ZEXT1632(auVar123),auVar21,auVar146);
        auVar146 = vblendvps_avx(ZEXT1632(auVar220),auVar149,auVar146);
        auVar123 = vfmadd213ps_fma(auVar175,local_5a0,ZEXT1632(auVar209));
        auVar218 = vfmadd213ps_fma(auVar202,auVar202,ZEXT832(0) << 0x20);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar22,auVar22);
        auVar175 = vrsqrtps_avx(ZEXT1632(auVar218));
        fVar156 = auVar175._0_4_;
        fVar203 = auVar175._4_4_;
        fVar204 = auVar175._8_4_;
        fVar205 = auVar175._12_4_;
        fVar206 = auVar175._16_4_;
        fVar207 = auVar175._20_4_;
        fVar208 = auVar175._24_4_;
        auVar38._4_4_ = fVar203 * fVar203 * fVar203 * auVar218._4_4_ * -0.5;
        auVar38._0_4_ = fVar156 * fVar156 * fVar156 * auVar218._0_4_ * -0.5;
        auVar38._8_4_ = fVar204 * fVar204 * fVar204 * auVar218._8_4_ * -0.5;
        auVar38._12_4_ = fVar205 * fVar205 * fVar205 * auVar218._12_4_ * -0.5;
        auVar38._16_4_ = fVar206 * fVar206 * fVar206 * -0.0;
        auVar38._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
        auVar38._24_4_ = fVar208 * fVar208 * fVar208 * -0.0;
        auVar38._28_4_ = 0;
        auVar244._8_4_ = 0x3fc00000;
        auVar244._0_8_ = 0x3fc000003fc00000;
        auVar244._12_4_ = 0x3fc00000;
        auVar244._16_4_ = 0x3fc00000;
        auVar244._20_4_ = 0x3fc00000;
        auVar244._24_4_ = 0x3fc00000;
        auVar244._28_4_ = 0x3fc00000;
        auVar218 = vfmadd231ps_fma(auVar38,auVar244,auVar175);
        fVar156 = auVar218._0_4_;
        fVar203 = auVar218._4_4_;
        auVar39._4_4_ = auVar22._4_4_ * fVar203;
        auVar39._0_4_ = auVar22._0_4_ * fVar156;
        fVar204 = auVar218._8_4_;
        auVar39._8_4_ = auVar22._8_4_ * fVar204;
        fVar205 = auVar218._12_4_;
        auVar39._12_4_ = auVar22._12_4_ * fVar205;
        auVar39._16_4_ = auVar22._16_4_ * 0.0;
        auVar39._20_4_ = auVar22._20_4_ * 0.0;
        auVar39._24_4_ = auVar22._24_4_ * 0.0;
        auVar39._28_4_ = auVar175._28_4_;
        auVar40._4_4_ = -auVar202._4_4_ * fVar203;
        auVar40._0_4_ = -auVar202._0_4_ * fVar156;
        auVar40._8_4_ = -auVar202._8_4_ * fVar204;
        auVar40._12_4_ = -auVar202._12_4_ * fVar205;
        auVar40._16_4_ = -auVar202._16_4_ * 0.0;
        auVar40._20_4_ = -auVar202._20_4_ * 0.0;
        auVar40._24_4_ = -auVar202._24_4_ * 0.0;
        auVar40._28_4_ = auVar202._28_4_ ^ 0x80000000;
        auVar218 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar146,auVar146);
        auVar202 = vrsqrtps_avx(ZEXT1632(auVar218));
        auVar175 = ZEXT1632(CONCAT412(fVar205 * 0.0,
                                      CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar156 * 0.0)))
                           );
        fVar156 = auVar202._0_4_;
        fVar203 = auVar202._4_4_;
        fVar204 = auVar202._8_4_;
        fVar205 = auVar202._12_4_;
        fVar206 = auVar202._16_4_;
        fVar207 = auVar202._20_4_;
        fVar208 = auVar202._24_4_;
        auVar41._4_4_ = fVar203 * fVar203 * auVar218._4_4_ * -0.5 * fVar203;
        auVar41._0_4_ = fVar156 * fVar156 * auVar218._0_4_ * -0.5 * fVar156;
        auVar41._8_4_ = fVar204 * fVar204 * auVar218._8_4_ * -0.5 * fVar204;
        auVar41._12_4_ = fVar205 * fVar205 * auVar218._12_4_ * -0.5 * fVar205;
        auVar41._16_4_ = fVar206 * fVar206 * fVar206 * -0.0;
        auVar41._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
        auVar41._24_4_ = fVar208 * fVar208 * fVar208 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar218 = vfmadd231ps_fma(auVar41,auVar244,auVar202);
        fVar156 = auVar218._0_4_;
        fVar203 = auVar218._4_4_;
        auVar42._4_4_ = fVar203 * auVar146._4_4_;
        auVar42._0_4_ = fVar156 * auVar146._0_4_;
        fVar204 = auVar218._8_4_;
        auVar42._8_4_ = fVar204 * auVar146._8_4_;
        fVar205 = auVar218._12_4_;
        auVar42._12_4_ = fVar205 * auVar146._12_4_;
        auVar42._16_4_ = auVar146._16_4_ * 0.0;
        auVar42._20_4_ = auVar146._20_4_ * 0.0;
        auVar42._24_4_ = auVar146._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._4_4_ = fVar203 * -auVar126._4_4_;
        auVar43._0_4_ = fVar156 * -auVar126._0_4_;
        auVar43._8_4_ = fVar204 * -auVar126._8_4_;
        auVar43._12_4_ = fVar205 * -auVar126._12_4_;
        auVar43._16_4_ = -auVar126._16_4_ * 0.0;
        auVar43._20_4_ = -auVar126._20_4_ * 0.0;
        auVar43._24_4_ = -auVar126._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._28_4_ = auVar202._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar205 * 0.0,
                                CONCAT48(fVar204 * 0.0,CONCAT44(fVar203 * 0.0,fVar156 * 0.0))));
        auVar218 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar20),local_380);
        auVar126 = ZEXT1632(auVar20);
        auVar209 = vfmadd213ps_fma(auVar40,auVar126,auVar128);
        auVar210 = vfmadd213ps_fma(auVar175,auVar126,ZEXT1632(auVar123));
        auVar24 = vfnmadd213ps_fma(auVar39,auVar126,local_380);
        auVar219 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar184),auVar141);
        auVar25 = vfnmadd213ps_fma(auVar40,auVar126,auVar128);
        auVar126 = ZEXT1632(auVar184);
        auVar220 = vfmadd213ps_fma(auVar43,auVar126,auVar169);
        auVar213 = ZEXT1632(auVar20);
        auVar236 = vfnmadd231ps_fma(ZEXT1632(auVar123),auVar213,auVar175);
        auVar123 = vfmadd213ps_fma(auVar44,auVar126,ZEXT1632(auVar192));
        auVar230 = vfnmadd213ps_fma(auVar42,auVar126,auVar141);
        auVar234 = vfnmadd213ps_fma(auVar43,auVar126,auVar169);
        auVar125 = vfnmadd231ps_fma(ZEXT1632(auVar192),ZEXT1632(auVar184),auVar44);
        auVar126 = vsubps_avx(ZEXT1632(auVar220),ZEXT1632(auVar25));
        auVar146 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar236));
        auVar170._0_4_ = auVar236._0_4_ * auVar126._0_4_;
        auVar170._4_4_ = auVar236._4_4_ * auVar126._4_4_;
        auVar170._8_4_ = auVar236._8_4_ * auVar126._8_4_;
        auVar170._12_4_ = auVar236._12_4_ * auVar126._12_4_;
        auVar170._16_4_ = auVar126._16_4_ * 0.0;
        auVar170._20_4_ = auVar126._20_4_ * 0.0;
        auVar170._24_4_ = auVar126._24_4_ * 0.0;
        auVar170._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar170,ZEXT1632(auVar25),auVar146);
        auVar45._4_4_ = auVar146._4_4_ * auVar24._4_4_;
        auVar45._0_4_ = auVar146._0_4_ * auVar24._0_4_;
        auVar45._8_4_ = auVar146._8_4_ * auVar24._8_4_;
        auVar45._12_4_ = auVar146._12_4_ * auVar24._12_4_;
        auVar45._16_4_ = auVar146._16_4_ * 0.0;
        auVar45._20_4_ = auVar146._20_4_ * 0.0;
        auVar45._24_4_ = auVar146._24_4_ * 0.0;
        auVar45._28_4_ = auVar146._28_4_;
        auVar146 = vsubps_avx(ZEXT1632(auVar219),ZEXT1632(auVar24));
        auVar192 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar236),auVar146);
        auVar46._4_4_ = auVar25._4_4_ * auVar146._4_4_;
        auVar46._0_4_ = auVar25._0_4_ * auVar146._0_4_;
        auVar46._8_4_ = auVar25._8_4_ * auVar146._8_4_;
        auVar46._12_4_ = auVar25._12_4_ * auVar146._12_4_;
        auVar46._16_4_ = auVar146._16_4_ * 0.0;
        auVar46._20_4_ = auVar146._20_4_ * 0.0;
        auVar46._24_4_ = auVar146._24_4_ * 0.0;
        auVar46._28_4_ = auVar146._28_4_;
        auVar198 = ZEXT1632(auVar24);
        auVar24 = vfmsub231ps_fma(auVar46,auVar198,auVar126);
        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar192));
        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar172 = vcmpps_avx(ZEXT1632(auVar192),ZEXT832(0) << 0x20,2);
        auVar126 = vblendvps_avx(ZEXT1632(auVar230),ZEXT1632(auVar218),auVar172);
        auVar146 = vblendvps_avx(ZEXT1632(auVar234),ZEXT1632(auVar209),auVar172);
        auVar202 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar210),auVar172);
        auVar175 = vblendvps_avx(auVar198,ZEXT1632(auVar219),auVar172);
        auVar22 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar220),auVar172);
        auVar228 = vblendvps_avx(ZEXT1632(auVar236),ZEXT1632(auVar123),auVar172);
        auVar198 = vblendvps_avx(ZEXT1632(auVar219),auVar198,auVar172);
        auVar137 = vblendvps_avx(ZEXT1632(auVar220),ZEXT1632(auVar25),auVar172);
        auVar192 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar236),auVar172);
        auVar128 = vsubps_avx(auVar198,auVar126);
        auVar141 = vsubps_avx(auVar137,auVar146);
        auVar169 = vsubps_avx(auVar21,auVar202);
        auVar174 = vsubps_avx(auVar126,auVar175);
        auVar225 = vsubps_avx(auVar146,auVar22);
        auVar243 = vsubps_avx(auVar202,auVar228);
        auVar47._4_4_ = auVar169._4_4_ * auVar126._4_4_;
        auVar47._0_4_ = auVar169._0_4_ * auVar126._0_4_;
        auVar47._8_4_ = auVar169._8_4_ * auVar126._8_4_;
        auVar47._12_4_ = auVar169._12_4_ * auVar126._12_4_;
        auVar47._16_4_ = auVar169._16_4_ * auVar126._16_4_;
        auVar47._20_4_ = auVar169._20_4_ * auVar126._20_4_;
        auVar47._24_4_ = auVar169._24_4_ * auVar126._24_4_;
        auVar47._28_4_ = auVar21._28_4_;
        auVar123 = vfmsub231ps_fma(auVar47,auVar202,auVar128);
        auVar48._4_4_ = auVar146._4_4_ * auVar128._4_4_;
        auVar48._0_4_ = auVar146._0_4_ * auVar128._0_4_;
        auVar48._8_4_ = auVar146._8_4_ * auVar128._8_4_;
        auVar48._12_4_ = auVar146._12_4_ * auVar128._12_4_;
        auVar48._16_4_ = auVar146._16_4_ * auVar128._16_4_;
        auVar48._20_4_ = auVar146._20_4_ * auVar128._20_4_;
        auVar48._24_4_ = auVar146._24_4_ * auVar128._24_4_;
        auVar48._28_4_ = auVar198._28_4_;
        auVar218 = vfmsub231ps_fma(auVar48,auVar126,auVar141);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar218),ZEXT832(0) << 0x20,ZEXT1632(auVar123));
        auVar132._0_4_ = auVar141._0_4_ * auVar202._0_4_;
        auVar132._4_4_ = auVar141._4_4_ * auVar202._4_4_;
        auVar132._8_4_ = auVar141._8_4_ * auVar202._8_4_;
        auVar132._12_4_ = auVar141._12_4_ * auVar202._12_4_;
        auVar132._16_4_ = auVar141._16_4_ * auVar202._16_4_;
        auVar132._20_4_ = auVar141._20_4_ * auVar202._20_4_;
        auVar132._24_4_ = auVar141._24_4_ * auVar202._24_4_;
        auVar132._28_4_ = 0;
        auVar218 = vfmsub231ps_fma(auVar132,auVar146,auVar169);
        auVar218 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar218));
        auVar179 = ZEXT1664(auVar218);
        auVar133._0_4_ = auVar243._0_4_ * auVar175._0_4_;
        auVar133._4_4_ = auVar243._4_4_ * auVar175._4_4_;
        auVar133._8_4_ = auVar243._8_4_ * auVar175._8_4_;
        auVar133._12_4_ = auVar243._12_4_ * auVar175._12_4_;
        auVar133._16_4_ = auVar243._16_4_ * auVar175._16_4_;
        auVar133._20_4_ = auVar243._20_4_ * auVar175._20_4_;
        auVar133._24_4_ = auVar243._24_4_ * auVar175._24_4_;
        auVar133._28_4_ = 0;
        auVar123 = vfmsub231ps_fma(auVar133,auVar174,auVar228);
        auVar49._4_4_ = auVar225._4_4_ * auVar228._4_4_;
        auVar49._0_4_ = auVar225._0_4_ * auVar228._0_4_;
        auVar49._8_4_ = auVar225._8_4_ * auVar228._8_4_;
        auVar49._12_4_ = auVar225._12_4_ * auVar228._12_4_;
        auVar49._16_4_ = auVar225._16_4_ * auVar228._16_4_;
        auVar49._20_4_ = auVar225._20_4_ * auVar228._20_4_;
        auVar49._24_4_ = auVar225._24_4_ * auVar228._24_4_;
        auVar49._28_4_ = auVar228._28_4_;
        auVar20 = vfmsub231ps_fma(auVar49,auVar22,auVar243);
        auVar50._4_4_ = auVar174._4_4_ * auVar22._4_4_;
        auVar50._0_4_ = auVar174._0_4_ * auVar22._0_4_;
        auVar50._8_4_ = auVar174._8_4_ * auVar22._8_4_;
        auVar50._12_4_ = auVar174._12_4_ * auVar22._12_4_;
        auVar50._16_4_ = auVar174._16_4_ * auVar22._16_4_;
        auVar50._20_4_ = auVar174._20_4_ * auVar22._20_4_;
        auVar50._24_4_ = auVar174._24_4_ * auVar22._24_4_;
        auVar50._28_4_ = auVar137._28_4_;
        auVar209 = vfmsub231ps_fma(auVar50,auVar225,auVar175);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar209),ZEXT832(0) << 0x20,ZEXT1632(auVar123));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar175 = vmaxps_avx(ZEXT1632(auVar218),ZEXT1632(auVar20));
        auVar175 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,2);
        auVar123 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
        auVar192 = vpand_avx(auVar123,auVar192);
        auVar175 = vpmovsxwd_avx2(auVar192);
        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0x7f,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar175 >> 0xbf,0) == '\0') &&
            (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar175[0x1f]) {
LAB_018f6bd3:
          auVar216 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar232 = ZEXT3264(auVar135);
          auVar229 = ZEXT3264(auVar139);
        }
        else {
          auVar51._4_4_ = auVar141._4_4_ * auVar243._4_4_;
          auVar51._0_4_ = auVar141._0_4_ * auVar243._0_4_;
          auVar51._8_4_ = auVar141._8_4_ * auVar243._8_4_;
          auVar51._12_4_ = auVar141._12_4_ * auVar243._12_4_;
          auVar51._16_4_ = auVar141._16_4_ * auVar243._16_4_;
          auVar51._20_4_ = auVar141._20_4_ * auVar243._20_4_;
          auVar51._24_4_ = auVar141._24_4_ * auVar243._24_4_;
          auVar51._28_4_ = auVar175._28_4_;
          auVar219 = vfmsub231ps_fma(auVar51,auVar225,auVar169);
          auVar144._0_4_ = auVar169._0_4_ * auVar174._0_4_;
          auVar144._4_4_ = auVar169._4_4_ * auVar174._4_4_;
          auVar144._8_4_ = auVar169._8_4_ * auVar174._8_4_;
          auVar144._12_4_ = auVar169._12_4_ * auVar174._12_4_;
          auVar144._16_4_ = auVar169._16_4_ * auVar174._16_4_;
          auVar144._20_4_ = auVar169._20_4_ * auVar174._20_4_;
          auVar144._24_4_ = auVar169._24_4_ * auVar174._24_4_;
          auVar144._28_4_ = 0;
          auVar210 = vfmsub231ps_fma(auVar144,auVar128,auVar243);
          auVar52._4_4_ = auVar225._4_4_ * auVar128._4_4_;
          auVar52._0_4_ = auVar225._0_4_ * auVar128._0_4_;
          auVar52._8_4_ = auVar225._8_4_ * auVar128._8_4_;
          auVar52._12_4_ = auVar225._12_4_ * auVar128._12_4_;
          auVar52._16_4_ = auVar225._16_4_ * auVar128._16_4_;
          auVar52._20_4_ = auVar225._20_4_ * auVar128._20_4_;
          auVar52._24_4_ = auVar225._24_4_ * auVar128._24_4_;
          auVar52._28_4_ = auVar22._28_4_;
          auVar220 = vfmsub231ps_fma(auVar52,auVar174,auVar141);
          auVar123 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar210),ZEXT1632(auVar220));
          auVar209 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT1632(auVar219),ZEXT832(0) << 0x20);
          auVar175 = vrcpps_avx(ZEXT1632(auVar209));
          auVar231._8_4_ = 0x3f800000;
          auVar231._0_8_ = &DAT_3f8000003f800000;
          auVar231._12_4_ = 0x3f800000;
          auVar231._16_4_ = 0x3f800000;
          auVar231._20_4_ = 0x3f800000;
          auVar231._24_4_ = 0x3f800000;
          auVar231._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_fma(auVar175,ZEXT1632(auVar209),auVar231);
          auVar123 = vfmadd132ps_fma(ZEXT1632(auVar123),auVar175,auVar175);
          auVar214._0_4_ = auVar220._0_4_ * auVar202._0_4_;
          auVar214._4_4_ = auVar220._4_4_ * auVar202._4_4_;
          auVar214._8_4_ = auVar220._8_4_ * auVar202._8_4_;
          auVar214._12_4_ = auVar220._12_4_ * auVar202._12_4_;
          auVar214._16_4_ = auVar202._16_4_ * 0.0;
          auVar214._20_4_ = auVar202._20_4_ * 0.0;
          auVar214._24_4_ = auVar202._24_4_ * 0.0;
          auVar214._28_4_ = 0;
          auVar210 = vfmadd231ps_fma(auVar214,auVar146,ZEXT1632(auVar210));
          auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),ZEXT1632(auVar219),auVar126);
          fVar156 = auVar123._0_4_;
          fVar203 = auVar123._4_4_;
          fVar204 = auVar123._8_4_;
          fVar205 = auVar123._12_4_;
          auVar202 = ZEXT1632(CONCAT412(fVar205 * auVar210._12_4_,
                                        CONCAT48(fVar204 * auVar210._8_4_,
                                                 CONCAT44(fVar203 * auVar210._4_4_,
                                                          fVar156 * auVar210._0_4_))));
          auVar134._4_4_ = uVar117;
          auVar134._0_4_ = uVar117;
          auVar134._8_4_ = uVar117;
          auVar134._12_4_ = uVar117;
          auVar134._16_4_ = uVar117;
          auVar134._20_4_ = uVar117;
          auVar134._24_4_ = uVar117;
          auVar134._28_4_ = uVar117;
          uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar145._4_4_ = uVar121;
          auVar145._0_4_ = uVar121;
          auVar145._8_4_ = uVar121;
          auVar145._12_4_ = uVar121;
          auVar145._16_4_ = uVar121;
          auVar145._20_4_ = uVar121;
          auVar145._24_4_ = uVar121;
          auVar145._28_4_ = uVar121;
          auVar126 = vcmpps_avx(auVar134,auVar202,2);
          auVar146 = vcmpps_avx(auVar202,auVar145,2);
          auVar126 = vandps_avx(auVar146,auVar126);
          auVar123 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
          auVar192 = vpand_avx(auVar192,auVar123);
          auVar126 = vpmovsxwd_avx2(auVar192);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0x7f,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0xbf,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar126[0x1f]) goto LAB_018f6bd3;
          auVar126 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar209),4);
          auVar123 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
          auVar192 = vpand_avx(auVar192,auVar123);
          auVar126 = vpmovsxwd_avx2(auVar192);
          auVar216 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar232 = ZEXT3264(auVar135);
          auVar229 = ZEXT3264(auVar139);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            auVar135 = ZEXT1632(CONCAT412(fVar205 * auVar218._12_4_,
                                          CONCAT48(fVar204 * auVar218._8_4_,
                                                   CONCAT44(fVar203 * auVar218._4_4_,
                                                            fVar156 * auVar218._0_4_))));
            auVar146 = ZEXT1632(CONCAT412(fVar205 * auVar20._12_4_,
                                          CONCAT48(fVar204 * auVar20._8_4_,
                                                   CONCAT44(fVar203 * auVar20._4_4_,
                                                            fVar156 * auVar20._0_4_))));
            auVar195._8_4_ = 0x3f800000;
            auVar195._0_8_ = &DAT_3f8000003f800000;
            auVar195._12_4_ = 0x3f800000;
            auVar195._16_4_ = 0x3f800000;
            auVar195._20_4_ = 0x3f800000;
            auVar195._24_4_ = 0x3f800000;
            auVar195._28_4_ = 0x3f800000;
            auVar139 = vsubps_avx(auVar195,auVar135);
            auVar179 = ZEXT3264(auVar139);
            auVar139 = vblendvps_avx(auVar139,auVar135,auVar172);
            auVar232 = ZEXT3264(auVar139);
            auVar139 = vsubps_avx(auVar195,auVar146);
            local_3c0 = vblendvps_avx(auVar139,auVar146,auVar172);
            auVar216 = ZEXT3264(auVar126);
            auVar229 = ZEXT3264(auVar202);
          }
        }
        auVar239 = ZEXT3264(_local_700);
        auVar126 = auVar216._0_32_;
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar216 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar216[0x1f]) {
          auVar155 = ZEXT3264(local_720);
          auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
          auVar224 = ZEXT3264(local_7c0);
          auVar216 = ZEXT3264(local_780);
        }
        else {
          auVar139 = vsubps_avx(ZEXT1632(auVar184),auVar213);
          auVar202 = auVar232._0_32_;
          auVar192 = vfmadd213ps_fma(auVar139,auVar202,auVar213);
          fVar156 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar139._4_4_ = (auVar192._4_4_ + auVar192._4_4_) * fVar156;
          auVar139._0_4_ = (auVar192._0_4_ + auVar192._0_4_) * fVar156;
          auVar139._8_4_ = (auVar192._8_4_ + auVar192._8_4_) * fVar156;
          auVar139._12_4_ = (auVar192._12_4_ + auVar192._12_4_) * fVar156;
          auVar139._16_4_ = fVar156 * 0.0;
          auVar139._20_4_ = fVar156 * 0.0;
          auVar139._24_4_ = fVar156 * 0.0;
          auVar139._28_4_ = 0;
          auVar146 = auVar229._0_32_;
          auVar139 = vcmpps_avx(auVar146,auVar139,6);
          auVar135 = auVar126 & auVar139;
          auVar221 = ZEXT3264(CONCAT428(local_7a0,
                                        CONCAT424(local_7a0,
                                                  CONCAT420(local_7a0,
                                                            CONCAT416(local_7a0,
                                                                      CONCAT412(local_7a0,
                                                                                CONCAT48(local_7a0,
                                                                                         CONCAT44(
                                                  local_7a0,local_7a0))))))));
          auVar224 = ZEXT3264(local_7c0);
          auVar216 = ZEXT3264(local_780);
          if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar135 >> 0x7f,0) != '\0') ||
                (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar135 >> 0xbf,0) != '\0') ||
              (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar135[0x1f] < '\0') {
            local_460 = vandps_avx(auVar139,auVar126);
            auVar147._8_4_ = 0xbf800000;
            auVar147._0_8_ = 0xbf800000bf800000;
            auVar147._12_4_ = 0xbf800000;
            auVar147._16_4_ = 0xbf800000;
            auVar147._20_4_ = 0xbf800000;
            auVar147._24_4_ = 0xbf800000;
            auVar147._28_4_ = 0xbf800000;
            auVar171._8_4_ = 0x40000000;
            auVar171._0_8_ = 0x4000000040000000;
            auVar171._12_4_ = 0x40000000;
            auVar171._16_4_ = 0x40000000;
            auVar171._20_4_ = 0x40000000;
            auVar171._24_4_ = 0x40000000;
            auVar171._28_4_ = 0x40000000;
            auVar179 = ZEXT3264(auVar171);
            auVar192 = vfmadd213ps_fma(local_3c0,auVar171,auVar147);
            local_500 = ZEXT1632(auVar192);
            local_3c0 = local_500;
            auVar126 = local_3c0;
            local_4c0 = 0;
            local_3c0 = auVar126;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar156 = 1.0 / auVar130._0_4_;
              local_440[0] = fVar156 * (auVar232._0_4_ + 0.0);
              local_440[1] = fVar156 * (auVar232._4_4_ + 1.0);
              local_440[2] = fVar156 * (auVar232._8_4_ + 2.0);
              local_440[3] = fVar156 * (auVar232._12_4_ + 3.0);
              fStack_430 = fVar156 * (auVar232._16_4_ + 4.0);
              fStack_42c = fVar156 * (auVar232._20_4_ + 5.0);
              fStack_428 = fVar156 * (auVar232._24_4_ + 6.0);
              fStack_424 = auVar232._28_4_ + 7.0;
              local_3c0._0_8_ = auVar192._0_8_;
              local_3c0._8_8_ = auVar192._8_8_;
              local_420 = local_3c0._0_8_;
              uStack_418 = local_3c0._8_8_;
              uStack_410 = 0;
              uStack_408 = 0;
              local_400 = auVar146;
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar126 = vblendvps_avx(auVar148,auVar146,local_460);
              auVar139 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar139 = vminps_avx(auVar126,auVar139);
              auVar135 = vshufpd_avx(auVar139,auVar139,5);
              auVar139 = vminps_avx(auVar139,auVar135);
              auVar135 = vpermpd_avx2(auVar139,0x4e);
              auVar139 = vminps_avx(auVar139,auVar135);
              auVar139 = vcmpps_avx(auVar126,auVar139,0);
              auVar135 = local_460 & auVar139;
              auVar126 = local_460;
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0x7f,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0xbf,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar135[0x1f] < '\0') {
                auVar126 = vandps_avx(auVar139,local_460);
              }
              uVar115 = vmovmskps_avx(auVar126);
              uVar117 = 0;
              for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
                uVar117 = uVar117 + 1;
              }
              uVar116 = (ulong)uVar117;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar156 = local_440[uVar116];
                uVar121 = *(undefined4 *)((long)&local_420 + uVar116 * 4);
                fVar203 = 1.0 - fVar156;
                auVar187 = ZEXT416((uint)(fVar156 * fVar203 * 4.0));
                auVar192 = vfnmsub213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),auVar187);
                auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),auVar187);
                fVar203 = fVar203 * -fVar203 * 0.5;
                fVar204 = auVar192._0_4_ * 0.5;
                fVar205 = auVar187._0_4_ * 0.5;
                fVar206 = fVar156 * fVar156 * 0.5;
                auVar216 = ZEXT3264(local_780);
                auVar185._0_4_ = fVar206 * local_820;
                auVar185._4_4_ = fVar206 * fStack_81c;
                auVar185._8_4_ = fVar206 * fStack_818;
                auVar185._12_4_ = fVar206 * fStack_814;
                auVar158._4_4_ = fVar205;
                auVar158._0_4_ = fVar205;
                auVar158._8_4_ = fVar205;
                auVar158._12_4_ = fVar205;
                auVar187 = vfmadd132ps_fma(auVar158,auVar185,*pauVar3);
                auVar186._4_4_ = fVar204;
                auVar186._0_4_ = fVar204;
                auVar186._8_4_ = fVar204;
                auVar186._12_4_ = fVar204;
                auVar187 = vfmadd132ps_fma(auVar186,auVar187,*pauVar2);
                auVar159._4_4_ = fVar203;
                auVar159._0_4_ = fVar203;
                auVar159._8_4_ = fVar203;
                auVar159._12_4_ = fVar203;
                auVar187 = vfmadd132ps_fma(auVar159,auVar187,*pauVar1);
                auVar179 = ZEXT1664(auVar187);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar116 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar187._0_4_;
                uVar233 = vextractps_avx(auVar187,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar233;
                uVar233 = vextractps_avx(auVar187,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar233;
                *(float *)(ray + k * 4 + 0x1e0) = fVar156;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar121;
                *(uint *)(ray + k * 4 + 0x220) = uVar16;
                *(uint *)(ray + k * 4 + 0x240) = uVar113;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_840 = CONCAT44(uVar113,uVar113);
                uStack_838._0_4_ = uVar113;
                uStack_838._4_4_ = uVar113;
                uStack_830._0_4_ = uVar113;
                uStack_830._4_4_ = uVar113;
                auVar112 = _local_840;
                uStack_828._0_4_ = uVar113;
                uStack_828._4_4_ = uVar113;
                auVar126 = _local_840;
                local_6e0._4_4_ = uVar16;
                local_6e0._0_4_ = uVar16;
                uStack_6d8._0_4_ = (float)uVar16;
                uStack_6d8._4_4_ = (float)uVar16;
                uStack_6d0._0_4_ = uVar16;
                uStack_6d0._4_4_ = uVar16;
                uStack_6c8._0_4_ = uVar16;
                uStack_6c8._4_4_ = uVar16;
                local_6c0 = ZEXT1632(*pauVar2);
                local_5c0 = ZEXT1632(*pauVar3);
                _local_5e0 = ZEXT1632(*pauVar4);
                local_680 = local_460;
                _local_600 = auVar149;
                local_520 = auVar202;
                local_4e0 = auVar146;
                local_4bc = iVar114;
                local_4b0 = uVar217;
                uStack_4a8 = uVar98;
                local_4a0 = uVar99;
                uStack_498 = uVar100;
                local_490 = uVar101;
                uStack_488 = uVar102;
                local_480 = uVar103;
                uStack_478 = uVar104;
                do {
                  uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar156 = local_440[uVar116];
                  auVar125._4_4_ = fVar156;
                  auVar125._0_4_ = fVar156;
                  auVar125._8_4_ = fVar156;
                  auVar125._12_4_ = fVar156;
                  local_280._16_4_ = fVar156;
                  local_280._0_16_ = auVar125;
                  local_280._20_4_ = fVar156;
                  local_280._24_4_ = fVar156;
                  local_280._28_4_ = fVar156;
                  uVar233 = *(undefined4 *)((long)&local_420 + uVar116 * 4);
                  local_260._4_4_ = uVar233;
                  local_260._0_4_ = uVar233;
                  local_260._8_4_ = uVar233;
                  local_260._12_4_ = uVar233;
                  local_260._16_4_ = uVar233;
                  local_260._20_4_ = uVar233;
                  local_260._24_4_ = uVar233;
                  local_260._28_4_ = uVar233;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar116 * 4);
                  fVar204 = 1.0 - fVar156;
                  auVar192 = ZEXT416((uint)(fVar156 * fVar204 * 4.0));
                  auVar123 = vfnmsub213ss_fma(auVar125,auVar125,auVar192);
                  auVar192 = vfmadd213ss_fma(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),auVar192)
                  ;
                  fVar203 = auVar192._0_4_ * 0.5;
                  fVar156 = fVar156 * fVar156 * 0.5;
                  auVar193._0_4_ = fVar156 * (float)local_5e0._0_4_;
                  auVar193._4_4_ = fVar156 * (float)local_5e0._4_4_;
                  auVar193._8_4_ = fVar156 * fStack_5d8;
                  auVar193._12_4_ = fVar156 * fStack_5d4;
                  auVar165._4_4_ = fVar203;
                  auVar165._0_4_ = fVar203;
                  auVar165._8_4_ = fVar203;
                  auVar165._12_4_ = fVar203;
                  auVar192 = vfmadd132ps_fma(auVar165,auVar193,local_5c0._0_16_);
                  fVar156 = auVar123._0_4_ * 0.5;
                  auVar194._4_4_ = fVar156;
                  auVar194._0_4_ = fVar156;
                  auVar194._8_4_ = fVar156;
                  auVar194._12_4_ = fVar156;
                  auVar192 = vfmadd132ps_fma(auVar194,auVar192,local_6c0._0_16_);
                  local_7f0.context = context->user;
                  fVar156 = fVar204 * -fVar204 * 0.5;
                  auVar166._4_4_ = fVar156;
                  auVar166._0_4_ = fVar156;
                  auVar166._8_4_ = fVar156;
                  auVar166._12_4_ = fVar156;
                  auVar123 = vfmadd132ps_fma(auVar166,auVar192,auVar187);
                  local_2e0 = auVar123._0_4_;
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  auVar192 = vmovshdup_avx(auVar123);
                  local_2c0._8_8_ = auVar192._0_8_;
                  local_2c0._0_8_ = local_2c0._8_8_;
                  local_2c0._16_8_ = local_2c0._8_8_;
                  local_2c0._24_8_ = local_2c0._8_8_;
                  auVar192 = vshufps_avx(auVar123,auVar123,0xaa);
                  auVar167._0_8_ = auVar192._0_8_;
                  auVar167._8_8_ = auVar167._0_8_;
                  auVar178._16_8_ = auVar167._0_8_;
                  auVar178._0_16_ = auVar167;
                  auVar178._24_8_ = auVar167._0_8_;
                  local_2a0 = auVar178;
                  local_240 = local_6e0;
                  uStack_238 = uStack_6d8;
                  uStack_230 = uStack_6d0;
                  uStack_228 = uStack_6c8;
                  uStack_830 = auVar112._16_8_;
                  uStack_828 = auVar126._24_8_;
                  local_220 = local_840;
                  uStack_218 = uStack_838;
                  uStack_210 = uStack_830;
                  uStack_208 = uStack_828;
                  auVar139 = vpcmpeqd_avx2(local_260,local_260);
                  local_748[1] = auVar139;
                  *local_748 = auVar139;
                  local_200 = (local_7f0.context)->instID[0];
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = (local_7f0.context)->instPrimID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_660 = local_340._0_8_;
                  uStack_658 = local_340._8_8_;
                  uStack_650 = local_340._16_8_;
                  uStack_648 = local_340._24_8_;
                  local_7f0.valid = (int *)&local_660;
                  local_7f0.geometryUserPtr = pGVar17->userPtr;
                  local_7f0.hit = (RTCHitN *)&local_2e0;
                  local_7f0.N = 8;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar178 = ZEXT1632(auVar167);
                    (*pGVar17->intersectionFilterN)(&local_7f0);
                    auVar179._8_56_ = extraout_var_00;
                    auVar179._0_8_ = extraout_XMM1_Qa_00;
                    auVar239 = ZEXT3264(_local_700);
                    auVar224 = ZEXT3264(local_7c0);
                    auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                  CONCAT424(fStack_788,
                                                            CONCAT420(fStack_78c,
                                                                      CONCAT416(fStack_790,
                                                                                CONCAT412(fStack_794
                                                                                          ,CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
                    auVar229 = ZEXT3264(auVar146);
                    auVar232 = ZEXT3264(auVar202);
                    auVar139 = vpcmpeqd_avx2(auVar179._0_32_,auVar179._0_32_);
                  }
                  auVar107._8_8_ = uStack_658;
                  auVar107._0_8_ = local_660;
                  auVar107._16_8_ = uStack_650;
                  auVar107._24_8_ = uStack_648;
                  auVar175 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar107);
                  auVar135 = auVar139 & ~auVar175;
                  if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar135 >> 0x7f,0) == '\0') &&
                        (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar135 >> 0xbf,0) == '\0') &&
                      (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar135[0x1f]) {
                    auVar179 = ZEXT3264(auVar175 ^ auVar139);
                    auVar216 = ZEXT3264(local_780);
                  }
                  else {
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar178 = ZEXT1632(auVar178._0_16_);
                      (*p_Var18)(&local_7f0);
                      auVar239 = ZEXT3264(_local_700);
                      auVar224 = ZEXT3264(local_7c0);
                      auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      auVar229 = ZEXT3264(auVar146);
                      auVar232 = ZEXT3264(auVar202);
                    }
                    auVar108._8_8_ = uStack_658;
                    auVar108._0_8_ = local_660;
                    auVar108._16_8_ = uStack_650;
                    auVar108._24_8_ = uStack_648;
                    auVar135 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar108);
                    auVar175 = vpcmpeqd_avx2(auVar178,auVar178);
                    auVar179 = ZEXT3264(auVar135 ^ auVar175);
                    auVar139 = auVar175 & ~auVar135;
                    auVar216 = ZEXT3264(local_780);
                    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar139 >> 0x7f,0) != '\0') ||
                          (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar139 >> 0xbf,0) != '\0') ||
                        (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar139[0x1f] < '\0') {
                      auVar153._0_4_ = auVar135._0_4_ ^ auVar175._0_4_;
                      auVar153._4_4_ = auVar135._4_4_ ^ auVar175._4_4_;
                      auVar153._8_4_ = auVar135._8_4_ ^ auVar175._8_4_;
                      auVar153._12_4_ = auVar135._12_4_ ^ auVar175._12_4_;
                      auVar153._16_4_ = auVar135._16_4_ ^ auVar175._16_4_;
                      auVar153._20_4_ = auVar135._20_4_ ^ auVar175._20_4_;
                      auVar153._24_4_ = auVar135._24_4_ ^ auVar175._24_4_;
                      auVar153._28_4_ = auVar135._28_4_ ^ auVar175._28_4_;
                      auVar139 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])local_7f0.hit);
                      *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar139;
                      auVar139 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar139;
                      auVar139 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar139;
                      auVar139 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar139;
                      auVar139 = vpmaskmovd_avx2(auVar153,*(undefined1 (*) [32])
                                                           (local_7f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar139;
                    }
                  }
                  auVar139 = auVar179._0_32_;
                  if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar139 >> 0x7f,0) == '\0') &&
                        (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                       SUB321(auVar139 >> 0xbf,0) == '\0') &&
                      (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                      -1 < auVar179[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar121;
                  }
                  *(undefined4 *)(local_680 + uVar116 * 4) = 0;
                  uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar140._4_4_ = uVar121;
                  auVar140._0_4_ = uVar121;
                  auVar140._8_4_ = uVar121;
                  auVar140._12_4_ = uVar121;
                  auVar140._16_4_ = uVar121;
                  auVar140._20_4_ = uVar121;
                  auVar140._24_4_ = uVar121;
                  auVar140._28_4_ = uVar121;
                  auVar135 = vcmpps_avx(auVar229._0_32_,auVar140,2);
                  auVar139 = vandps_avx(auVar135,local_680);
                  auVar135 = local_680 & auVar135;
                  bVar89 = (auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar90 = (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar88 = (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar87 = SUB321(auVar135 >> 0x7f,0) != '\0';
                  bVar86 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar85 = SUB321(auVar135 >> 0xbf,0) != '\0';
                  bVar84 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar83 = auVar135[0x1f] < '\0';
                  if (((((((bVar89 || bVar90) || bVar88) || bVar87) || bVar86) || bVar85) || bVar84)
                      || bVar83) {
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar135 = vblendvps_avx(auVar154,auVar229._0_32_,auVar139);
                    auVar175 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar175 = vminps_avx(auVar135,auVar175);
                    auVar22 = vshufpd_avx(auVar175,auVar175,5);
                    auVar175 = vminps_avx(auVar175,auVar22);
                    auVar22 = vpermpd_avx2(auVar175,0x4e);
                    local_680 = vminps_avx(auVar175,auVar22);
                    auVar175 = vcmpps_avx(auVar135,local_680,0);
                    auVar22 = auVar139 & auVar175;
                    auVar135 = auVar139;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar22[0x1f] < '\0') {
                      auVar135 = vandps_avx(auVar175,auVar139);
                    }
                    uVar115 = vmovmskps_avx(auVar135);
                    uVar117 = 0;
                    for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
                      uVar117 = uVar117 + 1;
                    }
                    uVar116 = (ulong)uVar117;
                  }
                  auVar179 = ZEXT3264(local_680);
                  local_680 = auVar139;
                } while (((((((bVar89 || bVar90) || bVar88) || bVar87) || bVar86) || bVar85) ||
                         bVar84) || bVar83);
              }
            }
          }
          auVar155 = ZEXT3264(local_720);
        }
      }
      if (8 < iVar114) {
        _local_700 = auVar239._0_32_;
        local_3a0._4_4_ = iVar114;
        local_3a0._0_4_ = iVar114;
        local_3a0._8_4_ = iVar114;
        local_3a0._12_4_ = iVar114;
        local_3a0._16_4_ = iVar114;
        local_3a0._20_4_ = iVar114;
        local_3a0._24_4_ = iVar114;
        local_3a0._28_4_ = iVar114;
        local_140 = fVar157;
        fStack_13c = fVar157;
        fStack_138 = fVar157;
        fStack_134 = fVar157;
        fStack_130 = fVar157;
        fStack_12c = fVar157;
        fStack_128 = fVar157;
        fStack_124 = fVar157;
        local_160 = local_740._0_4_;
        uStack_15c = local_740._0_4_;
        uStack_158 = local_740._0_4_;
        uStack_154 = local_740._0_4_;
        uStack_150 = local_740._0_4_;
        uStack_14c = local_740._0_4_;
        uStack_148 = local_740._0_4_;
        uStack_144 = local_740._0_4_;
        local_180 = 1.0 / (float)local_540._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_1a0 = uVar113;
        uStack_19c = uVar113;
        uStack_198 = uVar113;
        uStack_194 = uVar113;
        uStack_190 = uVar113;
        uStack_18c = uVar113;
        uStack_188 = uVar113;
        uStack_184 = uVar113;
        local_1c0 = uVar16;
        uStack_1bc = uVar16;
        uStack_1b8 = uVar16;
        uStack_1b4 = uVar16;
        uStack_1b0 = uVar16;
        uStack_1ac = uVar16;
        uStack_1a8 = uVar16;
        uStack_1a4 = uVar16;
        lVar120 = 8;
        auVar139 = auVar232._0_32_;
        auVar126 = auVar229._0_32_;
        do {
          auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar120 * 4 + lVar23);
          auVar146 = *(undefined1 (*) [32])(lVar23 + 0x222bfac + lVar120 * 4);
          auVar202 = *(undefined1 (*) [32])(lVar23 + 0x222c430 + lVar120 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar23 + 0x222c8b4 + lVar120 * 4);
          auVar111 = *pauVar5;
          auVar240._0_4_ = auVar221._0_4_ * *(float *)*pauVar5;
          auVar240._4_4_ = auVar221._4_4_ * *(float *)(*pauVar5 + 4);
          auVar240._8_4_ = auVar221._8_4_ * *(float *)(*pauVar5 + 8);
          auVar240._12_4_ = auVar221._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar240._16_4_ = auVar221._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar240._20_4_ = auVar221._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar240._28_36_ = auVar239._28_36_;
          auVar240._24_4_ = auVar221._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar239._0_4_ = fVar242 * *(float *)*pauVar5;
          auVar239._4_4_ = fVar246 * *(float *)(*pauVar5 + 4);
          auVar239._8_4_ = fVar242 * *(float *)(*pauVar5 + 8);
          auVar239._12_4_ = fVar246 * *(float *)(*pauVar5 + 0xc);
          auVar239._16_4_ = fVar242 * *(float *)(*pauVar5 + 0x10);
          auVar239._20_4_ = fVar246 * *(float *)(*pauVar5 + 0x14);
          auVar239._28_36_ = auVar179._28_36_;
          auVar239._24_4_ = fVar242 * *(float *)(*pauVar5 + 0x18);
          auVar187 = vfmadd231ps_fma(auVar240._0_32_,auVar202,auVar168);
          auVar192 = vfmadd231ps_fma(auVar239._0_32_,auVar202,auVar196);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar146,auVar224._0_32_);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar146,auVar155._0_32_);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar135,auVar216._0_32_);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar135,local_6a0);
          auVar175 = *(undefined1 (*) [32])(bspline_basis1 + lVar120 * 4 + lVar23);
          auVar22 = *(undefined1 (*) [32])(lVar23 + 0x222e3cc + lVar120 * 4);
          auVar228 = *(undefined1 (*) [32])(lVar23 + 0x222e850 + lVar120 * 4);
          pfVar6 = (float *)(lVar23 + 0x222ecd4 + lVar120 * 4);
          fVar208 = *pfVar6;
          fVar91 = pfVar6[1];
          fVar92 = pfVar6[2];
          fVar93 = pfVar6[3];
          fVar94 = pfVar6[4];
          fVar95 = pfVar6[5];
          fVar96 = pfVar6[6];
          auVar53._4_4_ = auVar221._4_4_ * fVar91;
          auVar53._0_4_ = auVar221._0_4_ * fVar208;
          auVar53._8_4_ = auVar221._8_4_ * fVar92;
          auVar53._12_4_ = auVar221._12_4_ * fVar93;
          auVar53._16_4_ = auVar221._16_4_ * fVar94;
          auVar53._20_4_ = auVar221._20_4_ * fVar95;
          auVar53._24_4_ = auVar221._24_4_ * fVar96;
          auVar53._28_4_ = local_6a0._28_4_;
          auVar222._0_4_ = fVar242 * fVar208;
          auVar222._4_4_ = fVar246 * fVar91;
          auVar222._8_4_ = fVar242 * fVar92;
          auVar222._12_4_ = fVar246 * fVar93;
          auVar222._16_4_ = fVar242 * fVar94;
          auVar222._20_4_ = fVar246 * fVar95;
          auVar222._28_36_ = auVar221._28_36_;
          auVar222._24_4_ = fVar242 * fVar96;
          auVar123 = vfmadd231ps_fma(auVar53,auVar228,auVar168);
          auVar218 = vfmadd231ps_fma(auVar222._0_32_,auVar228,auVar196);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar22,auVar224._0_32_);
          auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar22,auVar155._0_32_);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar175,auVar216._0_32_);
          auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar175,local_6a0);
          _local_5e0 = ZEXT1632(auVar123);
          local_380 = ZEXT1632(auVar187);
          local_6c0 = vsubps_avx(_local_5e0,local_380);
          local_5c0 = ZEXT1632(auVar218);
          auVar172 = ZEXT1632(auVar192);
          _local_600 = vsubps_avx(local_5c0,auVar172);
          auVar54._4_4_ = auVar192._4_4_ * local_6c0._4_4_;
          auVar54._0_4_ = auVar192._0_4_ * local_6c0._0_4_;
          auVar54._8_4_ = auVar192._8_4_ * local_6c0._8_4_;
          auVar54._12_4_ = auVar192._12_4_ * local_6c0._12_4_;
          auVar54._16_4_ = local_6c0._16_4_ * 0.0;
          auVar54._20_4_ = local_6c0._20_4_ * 0.0;
          auVar54._24_4_ = local_6c0._24_4_ * 0.0;
          auVar54._28_4_ = auVar175._28_4_;
          fVar157 = local_600._0_4_;
          auVar216._0_4_ = auVar187._0_4_ * fVar157;
          fVar156 = local_600._4_4_;
          auVar216._4_4_ = auVar187._4_4_ * fVar156;
          fVar203 = local_600._8_4_;
          auVar216._8_4_ = auVar187._8_4_ * fVar203;
          fVar204 = local_600._12_4_;
          auVar216._12_4_ = auVar187._12_4_ * fVar204;
          fVar205 = local_600._16_4_;
          auVar216._16_4_ = fVar205 * 0.0;
          fVar206 = local_600._20_4_;
          auVar216._20_4_ = fVar206 * 0.0;
          fVar207 = local_600._24_4_;
          auVar216._28_36_ = auVar155._28_36_;
          auVar216._24_4_ = fVar207 * 0.0;
          auVar239 = ZEXT3264(auVar202);
          auVar137 = vsubps_avx(auVar54,auVar216._0_32_);
          local_920 = auVar111._0_4_;
          fStack_91c = auVar111._4_4_;
          fStack_918 = auVar111._8_4_;
          fStack_914 = auVar111._12_4_;
          fStack_910 = auVar111._16_4_;
          fStack_90c = auVar111._20_4_;
          fStack_908 = auVar111._24_4_;
          auVar173._0_4_ = (float)local_100 * local_920;
          auVar173._4_4_ = local_100._4_4_ * fStack_91c;
          auVar173._8_4_ = (float)uStack_f8 * fStack_918;
          auVar173._12_4_ = uStack_f8._4_4_ * fStack_914;
          auVar173._16_4_ = (float)uStack_f0 * fStack_910;
          auVar173._20_4_ = uStack_f0._4_4_ * fStack_90c;
          auVar173._24_4_ = (float)uStack_e8 * fStack_908;
          auVar173._28_4_ = 0;
          auVar187 = vfmadd231ps_fma(auVar173,auVar202,local_e0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar146,local_c0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),local_a0,auVar135);
          auVar179 = ZEXT1664(auVar187);
          auVar55._4_4_ = local_100._4_4_ * fVar91;
          auVar55._0_4_ = (float)local_100 * fVar208;
          auVar55._8_4_ = (float)uStack_f8 * fVar92;
          auVar55._12_4_ = uStack_f8._4_4_ * fVar93;
          auVar55._16_4_ = (float)uStack_f0 * fVar94;
          auVar55._20_4_ = uStack_f0._4_4_ * fVar95;
          auVar55._24_4_ = (float)uStack_e8 * fVar96;
          auVar55._28_4_ = uStack_e8._4_4_;
          auVar192 = vfmadd231ps_fma(auVar55,auVar228,local_e0);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar22,local_c0);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar175,local_a0);
          auVar56._4_4_ = fVar156 * fVar156;
          auVar56._0_4_ = fVar157 * fVar157;
          auVar56._8_4_ = fVar203 * fVar203;
          auVar56._12_4_ = fVar204 * fVar204;
          auVar56._16_4_ = fVar205 * fVar205;
          auVar56._20_4_ = fVar206 * fVar206;
          auVar56._24_4_ = fVar207 * fVar207;
          auVar56._28_4_ = local_a0._28_4_;
          auVar123 = vfmadd231ps_fma(auVar56,local_6c0,local_6c0);
          auVar149 = ZEXT1632(auVar192);
          auVar198 = vmaxps_avx(ZEXT1632(auVar187),auVar149);
          auVar226._0_4_ = auVar198._0_4_ * auVar198._0_4_ * auVar123._0_4_;
          auVar226._4_4_ = auVar198._4_4_ * auVar198._4_4_ * auVar123._4_4_;
          auVar226._8_4_ = auVar198._8_4_ * auVar198._8_4_ * auVar123._8_4_;
          auVar226._12_4_ = auVar198._12_4_ * auVar198._12_4_ * auVar123._12_4_;
          auVar226._16_4_ = auVar198._16_4_ * auVar198._16_4_ * 0.0;
          auVar226._20_4_ = auVar198._20_4_ * auVar198._20_4_ * 0.0;
          auVar226._24_4_ = auVar198._24_4_ * auVar198._24_4_ * 0.0;
          auVar226._28_4_ = 0;
          auVar57._4_4_ = auVar137._4_4_ * auVar137._4_4_;
          auVar57._0_4_ = auVar137._0_4_ * auVar137._0_4_;
          auVar57._8_4_ = auVar137._8_4_ * auVar137._8_4_;
          auVar57._12_4_ = auVar137._12_4_ * auVar137._12_4_;
          auVar57._16_4_ = auVar137._16_4_ * auVar137._16_4_;
          auVar57._20_4_ = auVar137._20_4_ * auVar137._20_4_;
          auVar57._24_4_ = auVar137._24_4_ * auVar137._24_4_;
          auVar57._28_4_ = pfVar6[7];
          auVar198 = vcmpps_avx(auVar57,auVar226,2);
          local_4c0 = (int)lVar120;
          auVar227._4_4_ = local_4c0;
          auVar227._0_4_ = local_4c0;
          auVar227._8_4_ = local_4c0;
          auVar227._12_4_ = local_4c0;
          auVar227._16_4_ = local_4c0;
          auVar227._20_4_ = local_4c0;
          auVar227._24_4_ = local_4c0;
          auVar227._28_4_ = local_4c0;
          auVar137 = vpor_avx2(auVar227,_DAT_0205a920);
          auVar21 = vpcmpgtd_avx2(local_3a0,auVar137);
          auVar137 = auVar21 & auVar198;
          if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar137 >> 0x7f,0) == '\0') &&
                (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar137 >> 0xbf,0) == '\0') &&
              (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar137[0x1f]) {
LAB_018f6369:
            auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            auVar224 = ZEXT3264(local_7c0);
            auVar216 = ZEXT3264(local_780);
          }
          else {
            local_540 = vandps_avx(auVar21,auVar198);
            auVar58._4_4_ = (float)local_700._4_4_ * fVar91;
            auVar58._0_4_ = (float)local_700._0_4_ * fVar208;
            auVar58._8_4_ = fStack_6f8 * fVar92;
            auVar58._12_4_ = fStack_6f4 * fVar93;
            auVar58._16_4_ = fStack_6f0 * fVar94;
            auVar58._20_4_ = fStack_6ec * fVar95;
            auVar58._24_4_ = fStack_6e8 * fVar96;
            auVar58._28_4_ = auVar198._28_4_;
            auVar192 = vfmadd213ps_fma(auVar228,local_300,auVar58);
            auVar192 = vfmadd213ps_fma(auVar22,local_580,ZEXT1632(auVar192));
            auVar192 = vfmadd132ps_fma(auVar175,ZEXT1632(auVar192),local_5a0);
            auVar59._4_4_ = (float)local_700._4_4_ * fStack_91c;
            auVar59._0_4_ = (float)local_700._0_4_ * local_920;
            auVar59._8_4_ = fStack_6f8 * fStack_918;
            auVar59._12_4_ = fStack_6f4 * fStack_914;
            auVar59._16_4_ = fStack_6f0 * fStack_910;
            auVar59._20_4_ = fStack_6ec * fStack_90c;
            auVar59._24_4_ = fStack_6e8 * fStack_908;
            auVar59._28_4_ = auVar198._28_4_;
            auVar123 = vfmadd213ps_fma(auVar202,local_300,auVar59);
            auVar123 = vfmadd213ps_fma(auVar146,local_580,ZEXT1632(auVar123));
            auVar146 = *(undefined1 (*) [32])(lVar23 + 0x222cd38 + lVar120 * 4);
            auVar202 = *(undefined1 (*) [32])(lVar23 + 0x222d1bc + lVar120 * 4);
            auVar175 = *(undefined1 (*) [32])(lVar23 + 0x222d640 + lVar120 * 4);
            pfVar6 = (float *)(lVar23 + 0x222dac4 + lVar120 * 4);
            fVar157 = *pfVar6;
            fVar156 = pfVar6[1];
            fVar203 = pfVar6[2];
            fVar204 = pfVar6[3];
            fVar205 = pfVar6[4];
            fVar206 = pfVar6[5];
            fVar207 = pfVar6[6];
            auVar60._4_4_ = fStack_79c * fVar156;
            auVar60._0_4_ = local_7a0 * fVar157;
            auVar60._8_4_ = fStack_798 * fVar203;
            auVar60._12_4_ = fStack_794 * fVar204;
            auVar60._16_4_ = fStack_790 * fVar205;
            auVar60._20_4_ = fStack_78c * fVar206;
            auVar60._24_4_ = fStack_788 * fVar207;
            auVar60._28_4_ = local_600._28_4_;
            auVar237._0_4_ = fVar242 * fVar157;
            auVar237._4_4_ = fVar246 * fVar156;
            auVar237._8_4_ = fVar242 * fVar203;
            auVar237._12_4_ = fVar246 * fVar204;
            auVar237._16_4_ = fVar242 * fVar205;
            auVar237._20_4_ = fVar246 * fVar206;
            auVar237._24_4_ = fVar242 * fVar207;
            auVar237._28_4_ = 0;
            auVar61._4_4_ = fVar156 * (float)local_700._4_4_;
            auVar61._0_4_ = fVar157 * (float)local_700._0_4_;
            auVar61._8_4_ = fVar203 * fStack_6f8;
            auVar61._12_4_ = fVar204 * fStack_6f4;
            auVar61._16_4_ = fVar205 * fStack_6f0;
            auVar61._20_4_ = fVar206 * fStack_6ec;
            auVar61._24_4_ = fVar207 * fStack_6e8;
            auVar61._28_4_ = pfVar6[7];
            auVar218 = vfmadd231ps_fma(auVar60,auVar175,auVar168);
            auVar20 = vfmadd231ps_fma(auVar237,auVar175,auVar196);
            auVar184 = vfmadd231ps_fma(auVar61,local_300,auVar175);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar202,local_7c0);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar202,local_720);
            auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),local_580,auVar202);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar146,local_780);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar146,local_6a0);
            auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),local_5a0,auVar146);
            pfVar6 = (float *)(lVar23 + 0x222fee4 + lVar120 * 4);
            fVar157 = *pfVar6;
            fVar156 = pfVar6[1];
            fVar203 = pfVar6[2];
            fVar204 = pfVar6[3];
            fVar205 = pfVar6[4];
            fVar206 = pfVar6[5];
            fVar207 = pfVar6[6];
            auVar62._4_4_ = fStack_79c * fVar156;
            auVar62._0_4_ = local_7a0 * fVar157;
            auVar62._8_4_ = fStack_798 * fVar203;
            auVar62._12_4_ = fStack_794 * fVar204;
            auVar62._16_4_ = fStack_790 * fVar205;
            auVar62._20_4_ = fStack_78c * fVar206;
            auVar62._24_4_ = fStack_788 * fVar207;
            auVar62._28_4_ = fStack_784;
            auVar63._4_4_ = fVar246 * fVar156;
            auVar63._0_4_ = fVar242 * fVar157;
            auVar63._8_4_ = fVar242 * fVar203;
            auVar63._12_4_ = fVar246 * fVar204;
            auVar63._16_4_ = fVar242 * fVar205;
            auVar63._20_4_ = fVar246 * fVar206;
            auVar63._24_4_ = fVar242 * fVar207;
            auVar63._28_4_ = fVar246;
            auVar64._4_4_ = fVar156 * (float)local_700._4_4_;
            auVar64._0_4_ = fVar157 * (float)local_700._0_4_;
            auVar64._8_4_ = fVar203 * fStack_6f8;
            auVar64._12_4_ = fVar204 * fStack_6f4;
            auVar64._16_4_ = fVar205 * fStack_6f0;
            auVar64._20_4_ = fVar206 * fStack_6ec;
            auVar64._24_4_ = fVar207 * fStack_6e8;
            auVar64._28_4_ = pfVar6[7];
            auVar146 = *(undefined1 (*) [32])(lVar23 + 0x222fa60 + lVar120 * 4);
            auVar209 = vfmadd231ps_fma(auVar62,auVar146,auVar168);
            auVar210 = vfmadd231ps_fma(auVar63,auVar146,auVar196);
            auVar219 = vfmadd231ps_fma(auVar64,local_300,auVar146);
            auVar146 = *(undefined1 (*) [32])(lVar23 + 0x222f5dc + lVar120 * 4);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar146,local_7c0);
            auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar146,local_720);
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_580,auVar146);
            auVar146 = *(undefined1 (*) [32])(lVar23 + 0x222f158 + lVar120 * 4);
            auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar146,local_780);
            auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar146,local_6a0);
            auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),local_5a0,auVar146);
            auVar146 = vandps_avx(ZEXT1632(auVar218),local_320);
            auVar202 = vandps_avx(ZEXT1632(auVar20),local_320);
            auVar202 = vmaxps_avx(auVar146,auVar202);
            auVar146 = vandps_avx(ZEXT1632(auVar184),local_320);
            auVar146 = vmaxps_avx(auVar202,auVar146);
            auVar110._4_4_ = fStack_13c;
            auVar110._0_4_ = local_140;
            auVar110._8_4_ = fStack_138;
            auVar110._12_4_ = fStack_134;
            auVar110._16_4_ = fStack_130;
            auVar110._20_4_ = fStack_12c;
            auVar110._24_4_ = fStack_128;
            auVar110._28_4_ = fStack_124;
            auVar146 = vcmpps_avx(auVar146,auVar110,1);
            auVar175 = vblendvps_avx(ZEXT1632(auVar218),local_6c0,auVar146);
            auVar22 = vblendvps_avx(ZEXT1632(auVar20),_local_600,auVar146);
            auVar146 = vandps_avx(ZEXT1632(auVar209),local_320);
            auVar202 = vandps_avx(ZEXT1632(auVar210),local_320);
            auVar202 = vmaxps_avx(auVar146,auVar202);
            auVar146 = vandps_avx(local_320,ZEXT1632(auVar219));
            auVar146 = vmaxps_avx(auVar202,auVar146);
            auVar202 = vcmpps_avx(auVar146,auVar110,1);
            auVar146 = vblendvps_avx(ZEXT1632(auVar209),local_6c0,auVar202);
            auVar202 = vblendvps_avx(ZEXT1632(auVar210),_local_600,auVar202);
            auVar123 = vfmadd213ps_fma(auVar135,local_5a0,ZEXT1632(auVar123));
            auVar218 = vfmadd213ps_fma(auVar175,auVar175,ZEXT832(0) << 0x20);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar22,auVar22);
            auVar135 = vrsqrtps_avx(ZEXT1632(auVar218));
            fVar157 = auVar135._0_4_;
            fVar156 = auVar135._4_4_;
            fVar203 = auVar135._8_4_;
            fVar204 = auVar135._12_4_;
            fVar205 = auVar135._16_4_;
            fVar206 = auVar135._20_4_;
            fVar207 = auVar135._24_4_;
            auVar65._4_4_ = fVar156 * fVar156 * fVar156 * auVar218._4_4_ * -0.5;
            auVar65._0_4_ = fVar157 * fVar157 * fVar157 * auVar218._0_4_ * -0.5;
            auVar65._8_4_ = fVar203 * fVar203 * fVar203 * auVar218._8_4_ * -0.5;
            auVar65._12_4_ = fVar204 * fVar204 * fVar204 * auVar218._12_4_ * -0.5;
            auVar65._16_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar65._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
            auVar65._24_4_ = fVar207 * fVar207 * fVar207 * -0.0;
            auVar65._28_4_ = 0;
            auVar245._8_4_ = 0x3fc00000;
            auVar245._0_8_ = 0x3fc000003fc00000;
            auVar245._12_4_ = 0x3fc00000;
            auVar245._16_4_ = 0x3fc00000;
            auVar245._20_4_ = 0x3fc00000;
            auVar245._24_4_ = 0x3fc00000;
            auVar245._28_4_ = 0x3fc00000;
            auVar218 = vfmadd231ps_fma(auVar65,auVar245,auVar135);
            fVar157 = auVar218._0_4_;
            fVar156 = auVar218._4_4_;
            auVar66._4_4_ = auVar22._4_4_ * fVar156;
            auVar66._0_4_ = auVar22._0_4_ * fVar157;
            fVar203 = auVar218._8_4_;
            auVar66._8_4_ = auVar22._8_4_ * fVar203;
            fVar204 = auVar218._12_4_;
            auVar66._12_4_ = auVar22._12_4_ * fVar204;
            auVar66._16_4_ = auVar22._16_4_ * 0.0;
            auVar66._20_4_ = auVar22._20_4_ * 0.0;
            auVar66._24_4_ = auVar22._24_4_ * 0.0;
            auVar66._28_4_ = auVar22._28_4_;
            auVar67._4_4_ = fVar156 * -auVar175._4_4_;
            auVar67._0_4_ = fVar157 * -auVar175._0_4_;
            auVar67._8_4_ = fVar203 * -auVar175._8_4_;
            auVar67._12_4_ = fVar204 * -auVar175._12_4_;
            auVar67._16_4_ = -auVar175._16_4_ * 0.0;
            auVar67._20_4_ = -auVar175._20_4_ * 0.0;
            auVar67._24_4_ = -auVar175._24_4_ * 0.0;
            auVar67._28_4_ = auVar135._28_4_;
            auVar218 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar202,auVar202);
            auVar135 = vrsqrtps_avx(ZEXT1632(auVar218));
            auVar68._28_4_ = local_5a0._28_4_;
            auVar68._0_28_ =
                 ZEXT1628(CONCAT412(fVar204 * 0.0,
                                    CONCAT48(fVar203 * 0.0,CONCAT44(fVar156 * 0.0,fVar157 * 0.0))));
            fVar157 = auVar135._0_4_;
            fVar156 = auVar135._4_4_;
            fVar203 = auVar135._8_4_;
            fVar204 = auVar135._12_4_;
            fVar205 = auVar135._16_4_;
            fVar206 = auVar135._20_4_;
            fVar207 = auVar135._24_4_;
            auVar69._4_4_ = fVar156 * fVar156 * fVar156 * auVar218._4_4_ * -0.5;
            auVar69._0_4_ = fVar157 * fVar157 * fVar157 * auVar218._0_4_ * -0.5;
            auVar69._8_4_ = fVar203 * fVar203 * fVar203 * auVar218._8_4_ * -0.5;
            auVar69._12_4_ = fVar204 * fVar204 * fVar204 * auVar218._12_4_ * -0.5;
            auVar69._16_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar69._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
            auVar69._24_4_ = fVar207 * fVar207 * fVar207 * -0.0;
            auVar69._28_4_ = 0;
            auVar218 = vfmadd231ps_fma(auVar69,auVar245,auVar135);
            fVar157 = auVar218._0_4_;
            fVar156 = auVar218._4_4_;
            auVar70._4_4_ = auVar202._4_4_ * fVar156;
            auVar70._0_4_ = auVar202._0_4_ * fVar157;
            fVar203 = auVar218._8_4_;
            auVar70._8_4_ = auVar202._8_4_ * fVar203;
            fVar204 = auVar218._12_4_;
            auVar70._12_4_ = auVar202._12_4_ * fVar204;
            auVar70._16_4_ = auVar202._16_4_ * 0.0;
            auVar70._20_4_ = auVar202._20_4_ * 0.0;
            auVar70._24_4_ = auVar202._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar71._4_4_ = fVar156 * -auVar146._4_4_;
            auVar71._0_4_ = fVar157 * -auVar146._0_4_;
            auVar71._8_4_ = fVar203 * -auVar146._8_4_;
            auVar71._12_4_ = fVar204 * -auVar146._12_4_;
            auVar71._16_4_ = -auVar146._16_4_ * 0.0;
            auVar71._20_4_ = -auVar146._20_4_ * 0.0;
            auVar71._24_4_ = -auVar146._24_4_ * 0.0;
            auVar71._28_4_ = auVar135._28_4_;
            auVar72._28_4_ = 0xbf000000;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar204 * 0.0,
                                    CONCAT48(fVar203 * 0.0,CONCAT44(fVar156 * 0.0,fVar157 * 0.0))));
            auVar218 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar187),local_380);
            auVar135 = ZEXT1632(auVar187);
            auVar20 = vfmadd213ps_fma(auVar67,auVar135,auVar172);
            auVar184 = vfmadd213ps_fma(auVar68,auVar135,ZEXT1632(auVar123));
            auVar220 = vfnmadd213ps_fma(auVar66,auVar135,local_380);
            auVar209 = vfmadd213ps_fma(auVar70,auVar149,_local_5e0);
            auVar24 = vfnmadd213ps_fma(auVar67,auVar135,auVar172);
            auVar210 = vfmadd213ps_fma(auVar71,auVar149,local_5c0);
            auVar174 = ZEXT1632(auVar187);
            auVar234 = vfnmadd231ps_fma(ZEXT1632(auVar123),auVar174,auVar68);
            auVar123 = vfmadd213ps_fma(auVar72,auVar149,ZEXT1632(auVar192));
            auVar25 = vfnmadd213ps_fma(auVar70,auVar149,_local_5e0);
            auVar230 = vfnmadd213ps_fma(auVar71,auVar149,local_5c0);
            auVar236 = vfnmadd231ps_fma(ZEXT1632(auVar192),auVar149,auVar72);
            auVar135 = vsubps_avx(ZEXT1632(auVar210),ZEXT1632(auVar24));
            auVar146 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar234));
            auVar73._4_4_ = auVar135._4_4_ * auVar234._4_4_;
            auVar73._0_4_ = auVar135._0_4_ * auVar234._0_4_;
            auVar73._8_4_ = auVar135._8_4_ * auVar234._8_4_;
            auVar73._12_4_ = auVar135._12_4_ * auVar234._12_4_;
            auVar73._16_4_ = auVar135._16_4_ * 0.0;
            auVar73._20_4_ = auVar135._20_4_ * 0.0;
            auVar73._24_4_ = auVar135._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar219 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar24),auVar146);
            auVar74._4_4_ = auVar220._4_4_ * auVar146._4_4_;
            auVar74._0_4_ = auVar220._0_4_ * auVar146._0_4_;
            auVar74._8_4_ = auVar220._8_4_ * auVar146._8_4_;
            auVar74._12_4_ = auVar220._12_4_ * auVar146._12_4_;
            auVar74._16_4_ = auVar146._16_4_ * 0.0;
            auVar74._20_4_ = auVar146._20_4_ * 0.0;
            auVar74._24_4_ = auVar146._24_4_ * 0.0;
            auVar74._28_4_ = auVar146._28_4_;
            auVar228 = ZEXT1632(auVar220);
            auVar146 = vsubps_avx(ZEXT1632(auVar209),auVar228);
            auVar137 = ZEXT1632(auVar234);
            auVar192 = vfmsub231ps_fma(auVar74,auVar137,auVar146);
            auVar75._4_4_ = auVar24._4_4_ * auVar146._4_4_;
            auVar75._0_4_ = auVar24._0_4_ * auVar146._0_4_;
            auVar75._8_4_ = auVar24._8_4_ * auVar146._8_4_;
            auVar75._12_4_ = auVar24._12_4_ * auVar146._12_4_;
            auVar75._16_4_ = auVar146._16_4_ * 0.0;
            auVar75._20_4_ = auVar146._20_4_ * 0.0;
            auVar75._24_4_ = auVar146._24_4_ * 0.0;
            auVar75._28_4_ = auVar146._28_4_;
            auVar220 = vfmsub231ps_fma(auVar75,auVar228,auVar135);
            auVar192 = vfmadd231ps_fma(ZEXT1632(auVar220),ZEXT832(0) << 0x20,ZEXT1632(auVar192));
            auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),ZEXT832(0) << 0x20,ZEXT1632(auVar219));
            auVar21 = vcmpps_avx(ZEXT1632(auVar192),ZEXT832(0) << 0x20,2);
            auVar135 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar218),auVar21);
            auVar146 = vblendvps_avx(ZEXT1632(auVar230),ZEXT1632(auVar20),auVar21);
            local_740 = vblendvps_avx(ZEXT1632(auVar236),ZEXT1632(auVar184),auVar21);
            auVar202 = vblendvps_avx(auVar228,ZEXT1632(auVar209),auVar21);
            auVar175 = vblendvps_avx(ZEXT1632(auVar24),ZEXT1632(auVar210),auVar21);
            auVar22 = vblendvps_avx(auVar137,ZEXT1632(auVar123),auVar21);
            auVar228 = vblendvps_avx(ZEXT1632(auVar209),auVar228,auVar21);
            auVar198 = vblendvps_avx(ZEXT1632(auVar210),ZEXT1632(auVar24),auVar21);
            auVar192 = vpackssdw_avx(local_540._0_16_,local_540._16_16_);
            auVar137 = vblendvps_avx(ZEXT1632(auVar123),auVar137,auVar21);
            auVar228 = vsubps_avx(auVar228,auVar135);
            auVar198 = vsubps_avx(auVar198,auVar146);
            auVar172 = vsubps_avx(auVar137,local_740);
            auVar239 = ZEXT3264(auVar172);
            auVar128 = vsubps_avx(auVar135,auVar202);
            auVar141 = vsubps_avx(auVar146,auVar175);
            auVar169 = vsubps_avx(local_740,auVar22);
            auVar199._0_4_ = auVar172._0_4_ * auVar135._0_4_;
            auVar199._4_4_ = auVar172._4_4_ * auVar135._4_4_;
            auVar199._8_4_ = auVar172._8_4_ * auVar135._8_4_;
            auVar199._12_4_ = auVar172._12_4_ * auVar135._12_4_;
            auVar199._16_4_ = auVar172._16_4_ * auVar135._16_4_;
            auVar199._20_4_ = auVar172._20_4_ * auVar135._20_4_;
            auVar199._24_4_ = auVar172._24_4_ * auVar135._24_4_;
            auVar199._28_4_ = 0;
            auVar123 = vfmsub231ps_fma(auVar199,local_740,auVar228);
            auVar76._4_4_ = auVar228._4_4_ * auVar146._4_4_;
            auVar76._0_4_ = auVar228._0_4_ * auVar146._0_4_;
            auVar76._8_4_ = auVar228._8_4_ * auVar146._8_4_;
            auVar76._12_4_ = auVar228._12_4_ * auVar146._12_4_;
            auVar76._16_4_ = auVar228._16_4_ * auVar146._16_4_;
            auVar76._20_4_ = auVar228._20_4_ * auVar146._20_4_;
            auVar76._24_4_ = auVar228._24_4_ * auVar146._24_4_;
            auVar76._28_4_ = auVar137._28_4_;
            auVar218 = vfmsub231ps_fma(auVar76,auVar135,auVar198);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar218),ZEXT1632(auVar123),_DAT_02020f00);
            auVar200._0_4_ = auVar198._0_4_ * local_740._0_4_;
            auVar200._4_4_ = auVar198._4_4_ * local_740._4_4_;
            auVar200._8_4_ = auVar198._8_4_ * local_740._8_4_;
            auVar200._12_4_ = auVar198._12_4_ * local_740._12_4_;
            auVar200._16_4_ = auVar198._16_4_ * local_740._16_4_;
            auVar200._20_4_ = auVar198._20_4_ * local_740._20_4_;
            auVar200._24_4_ = auVar198._24_4_ * local_740._24_4_;
            auVar200._28_4_ = 0;
            auVar218 = vfmsub231ps_fma(auVar200,auVar146,auVar172);
            auVar218 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar218));
            auVar179 = ZEXT1664(auVar218);
            auVar201._0_4_ = auVar169._0_4_ * auVar202._0_4_;
            auVar201._4_4_ = auVar169._4_4_ * auVar202._4_4_;
            auVar201._8_4_ = auVar169._8_4_ * auVar202._8_4_;
            auVar201._12_4_ = auVar169._12_4_ * auVar202._12_4_;
            auVar201._16_4_ = auVar169._16_4_ * auVar202._16_4_;
            auVar201._20_4_ = auVar169._20_4_ * auVar202._20_4_;
            auVar201._24_4_ = auVar169._24_4_ * auVar202._24_4_;
            auVar201._28_4_ = 0;
            auVar123 = vfmsub231ps_fma(auVar201,auVar128,auVar22);
            auVar77._4_4_ = auVar141._4_4_ * auVar22._4_4_;
            auVar77._0_4_ = auVar141._0_4_ * auVar22._0_4_;
            auVar77._8_4_ = auVar141._8_4_ * auVar22._8_4_;
            auVar77._12_4_ = auVar141._12_4_ * auVar22._12_4_;
            auVar77._16_4_ = auVar141._16_4_ * auVar22._16_4_;
            auVar77._20_4_ = auVar141._20_4_ * auVar22._20_4_;
            auVar77._24_4_ = auVar141._24_4_ * auVar22._24_4_;
            auVar77._28_4_ = auVar22._28_4_;
            auVar20 = vfmsub231ps_fma(auVar77,auVar175,auVar169);
            auVar78._4_4_ = auVar128._4_4_ * auVar175._4_4_;
            auVar78._0_4_ = auVar128._0_4_ * auVar175._0_4_;
            auVar78._8_4_ = auVar128._8_4_ * auVar175._8_4_;
            auVar78._12_4_ = auVar128._12_4_ * auVar175._12_4_;
            auVar78._16_4_ = auVar128._16_4_ * auVar175._16_4_;
            auVar78._20_4_ = auVar128._20_4_ * auVar175._20_4_;
            auVar78._24_4_ = auVar128._24_4_ * auVar175._24_4_;
            auVar78._28_4_ = auVar175._28_4_;
            auVar184 = vfmsub231ps_fma(auVar78,auVar141,auVar202);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar184),ZEXT832(0) << 0x20,ZEXT1632(auVar123));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
            auVar202 = vmaxps_avx(ZEXT1632(auVar218),ZEXT1632(auVar20));
            auVar202 = vcmpps_avx(auVar202,ZEXT832(0) << 0x20,2);
            auVar123 = vpackssdw_avx(auVar202._0_16_,auVar202._16_16_);
            auVar192 = vpand_avx(auVar123,auVar192);
            auVar202 = vpmovsxwd_avx2(auVar192);
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar202 >> 0x7f,0) == '\0') &&
                  (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0xbf,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar202[0x1f]) {
LAB_018f66a6:
              auVar229 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
            }
            else {
              auVar79._4_4_ = auVar198._4_4_ * auVar169._4_4_;
              auVar79._0_4_ = auVar198._0_4_ * auVar169._0_4_;
              auVar79._8_4_ = auVar198._8_4_ * auVar169._8_4_;
              auVar79._12_4_ = auVar198._12_4_ * auVar169._12_4_;
              auVar79._16_4_ = auVar198._16_4_ * auVar169._16_4_;
              auVar79._20_4_ = auVar198._20_4_ * auVar169._20_4_;
              auVar79._24_4_ = auVar198._24_4_ * auVar169._24_4_;
              auVar79._28_4_ = auVar202._28_4_;
              auVar210 = vfmsub231ps_fma(auVar79,auVar141,auVar172);
              auVar215._0_4_ = auVar172._0_4_ * auVar128._0_4_;
              auVar215._4_4_ = auVar172._4_4_ * auVar128._4_4_;
              auVar215._8_4_ = auVar172._8_4_ * auVar128._8_4_;
              auVar215._12_4_ = auVar172._12_4_ * auVar128._12_4_;
              auVar215._16_4_ = auVar172._16_4_ * auVar128._16_4_;
              auVar215._20_4_ = auVar172._20_4_ * auVar128._20_4_;
              auVar215._24_4_ = auVar172._24_4_ * auVar128._24_4_;
              auVar215._28_4_ = 0;
              auVar209 = vfmsub231ps_fma(auVar215,auVar228,auVar169);
              auVar80._4_4_ = auVar228._4_4_ * auVar141._4_4_;
              auVar80._0_4_ = auVar228._0_4_ * auVar141._0_4_;
              auVar80._8_4_ = auVar228._8_4_ * auVar141._8_4_;
              auVar80._12_4_ = auVar228._12_4_ * auVar141._12_4_;
              auVar80._16_4_ = auVar228._16_4_ * auVar141._16_4_;
              auVar80._20_4_ = auVar228._20_4_ * auVar141._20_4_;
              auVar80._24_4_ = auVar228._24_4_ * auVar141._24_4_;
              auVar80._28_4_ = auVar141._28_4_;
              auVar219 = vfmsub231ps_fma(auVar80,auVar128,auVar198);
              auVar123 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar209),ZEXT1632(auVar219));
              auVar184 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT1632(auVar210),ZEXT832(0) << 0x20);
              auVar202 = vrcpps_avx(ZEXT1632(auVar184));
              auVar238._8_4_ = 0x3f800000;
              auVar238._0_8_ = &DAT_3f8000003f800000;
              auVar238._12_4_ = 0x3f800000;
              auVar238._16_4_ = 0x3f800000;
              auVar238._20_4_ = 0x3f800000;
              auVar238._24_4_ = 0x3f800000;
              auVar238._28_4_ = 0x3f800000;
              auVar239 = ZEXT3264(auVar238);
              auVar123 = vfnmadd213ps_fma(auVar202,ZEXT1632(auVar184),auVar238);
              auVar123 = vfmadd132ps_fma(ZEXT1632(auVar123),auVar202,auVar202);
              auVar181._0_4_ = auVar219._0_4_ * local_740._0_4_;
              auVar181._4_4_ = auVar219._4_4_ * local_740._4_4_;
              auVar181._8_4_ = auVar219._8_4_ * local_740._8_4_;
              auVar181._12_4_ = auVar219._12_4_ * local_740._12_4_;
              auVar181._16_4_ = local_740._16_4_ * 0.0;
              auVar181._20_4_ = local_740._20_4_ * 0.0;
              auVar181._24_4_ = local_740._24_4_ * 0.0;
              auVar181._28_4_ = 0;
              auVar209 = vfmadd231ps_fma(auVar181,ZEXT1632(auVar209),auVar146);
              auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar135,ZEXT1632(auVar210));
              fVar157 = auVar123._0_4_;
              fVar156 = auVar123._4_4_;
              fVar203 = auVar123._8_4_;
              fVar204 = auVar123._12_4_;
              auVar202 = ZEXT1632(CONCAT412(fVar204 * auVar209._12_4_,
                                            CONCAT48(fVar203 * auVar209._8_4_,
                                                     CONCAT44(fVar156 * auVar209._4_4_,
                                                              fVar157 * auVar209._0_4_))));
              uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar182._4_4_ = uVar121;
              auVar182._0_4_ = uVar121;
              auVar182._8_4_ = uVar121;
              auVar182._12_4_ = uVar121;
              auVar182._16_4_ = uVar121;
              auVar182._20_4_ = uVar121;
              auVar182._24_4_ = uVar121;
              auVar182._28_4_ = uVar121;
              auVar109._4_4_ = uStack_15c;
              auVar109._0_4_ = local_160;
              auVar109._8_4_ = uStack_158;
              auVar109._12_4_ = uStack_154;
              auVar109._16_4_ = uStack_150;
              auVar109._20_4_ = uStack_14c;
              auVar109._24_4_ = uStack_148;
              auVar109._28_4_ = uStack_144;
              auVar135 = vcmpps_avx(auVar109,auVar202,2);
              auVar146 = vcmpps_avx(auVar202,auVar182,2);
              auVar135 = vandps_avx(auVar146,auVar135);
              auVar123 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
              auVar192 = vpand_avx(auVar192,auVar123);
              auVar135 = vpmovsxwd_avx2(auVar192);
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar135 >> 0x7f,0) == '\0') &&
                    (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar135 >> 0xbf,0) == '\0') &&
                  (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar135[0x1f]) goto LAB_018f66a6;
              auVar135 = vcmpps_avx(ZEXT1632(auVar184),ZEXT832(0) << 0x20,4);
              auVar123 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
              auVar192 = vpand_avx(auVar192,auVar123);
              auVar135 = vpmovsxwd_avx2(auVar192);
              auVar229 = ZEXT3264(CONCAT824(uStack_608,
                                            CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0x7f,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0xbf,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar135[0x1f] < '\0') {
                auVar175 = ZEXT1632(CONCAT412(fVar204 * auVar218._12_4_,
                                              CONCAT48(fVar203 * auVar218._8_4_,
                                                       CONCAT44(fVar156 * auVar218._4_4_,
                                                                fVar157 * auVar218._0_4_))));
                auVar81._28_4_ = SUB84(uStack_608,4);
                auVar81._0_28_ =
                     ZEXT1628(CONCAT412(fVar204 * auVar20._12_4_,
                                        CONCAT48(fVar203 * auVar20._8_4_,
                                                 CONCAT44(fVar156 * auVar20._4_4_,
                                                          fVar157 * auVar20._0_4_))));
                auVar223._8_4_ = 0x3f800000;
                auVar223._0_8_ = &DAT_3f8000003f800000;
                auVar223._12_4_ = 0x3f800000;
                auVar223._16_4_ = 0x3f800000;
                auVar223._20_4_ = 0x3f800000;
                auVar223._24_4_ = 0x3f800000;
                auVar223._28_4_ = 0x3f800000;
                auVar146 = vsubps_avx(auVar223,auVar175);
                local_120 = vblendvps_avx(auVar146,auVar175,auVar21);
                auVar146 = vsubps_avx(auVar223,auVar81);
                local_3e0 = vblendvps_avx(auVar146,auVar81,auVar21);
                auVar179 = ZEXT3264(local_3e0);
                auVar229 = ZEXT3264(auVar135);
                local_560 = auVar202;
              }
            }
            auVar232 = ZEXT3264(auVar139);
            auVar135 = auVar229._0_32_;
            if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar135 >> 0x7f,0) == '\0') &&
                  (auVar229 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar135 >> 0xbf,0) == '\0') &&
                (auVar229 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar229[0x1f]) goto LAB_018f6369;
            auVar146 = vsubps_avx(auVar149,auVar174);
            auVar192 = vfmadd213ps_fma(auVar146,local_120,auVar174);
            fVar157 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar82._4_4_ = (auVar192._4_4_ + auVar192._4_4_) * fVar157;
            auVar82._0_4_ = (auVar192._0_4_ + auVar192._0_4_) * fVar157;
            auVar82._8_4_ = (auVar192._8_4_ + auVar192._8_4_) * fVar157;
            auVar82._12_4_ = (auVar192._12_4_ + auVar192._12_4_) * fVar157;
            auVar82._16_4_ = fVar157 * 0.0;
            auVar82._20_4_ = fVar157 * 0.0;
            auVar82._24_4_ = fVar157 * 0.0;
            auVar82._28_4_ = fVar157;
            auVar146 = vcmpps_avx(local_560,auVar82,6);
            auVar202 = auVar135 & auVar146;
            auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                          CONCAT424(fStack_788,
                                                    CONCAT420(fStack_78c,
                                                              CONCAT416(fStack_790,
                                                                        CONCAT412(fStack_794,
                                                                                  CONCAT48(
                                                  fStack_798,CONCAT44(fStack_79c,local_7a0))))))));
            auVar224 = ZEXT3264(local_7c0);
            auVar216 = ZEXT3264(local_780);
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar202 >> 0x7f,0) != '\0') ||
                  (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar202 >> 0xbf,0) != '\0') ||
                (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar202[0x1f] < '\0') {
              local_460 = vandps_avx(auVar146,auVar135);
              auVar150._8_4_ = 0xbf800000;
              auVar150._0_8_ = 0xbf800000bf800000;
              auVar150._12_4_ = 0xbf800000;
              auVar150._16_4_ = 0xbf800000;
              auVar150._20_4_ = 0xbf800000;
              auVar150._24_4_ = 0xbf800000;
              auVar150._28_4_ = 0xbf800000;
              auVar176._8_4_ = 0x40000000;
              auVar176._0_8_ = 0x4000000040000000;
              auVar176._12_4_ = 0x40000000;
              auVar176._16_4_ = 0x40000000;
              auVar176._20_4_ = 0x40000000;
              auVar176._24_4_ = 0x40000000;
              auVar176._28_4_ = 0x40000000;
              auVar179 = ZEXT3264(auVar176);
              auVar192 = vfmadd213ps_fma(local_3e0,auVar176,auVar150);
              local_520 = local_120;
              local_500 = ZEXT1632(auVar192);
              local_3e0 = local_500;
              auVar135 = local_3e0;
              local_4e0 = local_560;
              pGVar17 = (context->scene->geometries).items[uVar113].ptr;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar157 = (float)local_4c0;
                local_440[0] = (fVar157 + local_120._0_4_ + 0.0) * local_180;
                local_440[1] = (fVar157 + local_120._4_4_ + 1.0) * fStack_17c;
                local_440[2] = (fVar157 + local_120._8_4_ + 2.0) * fStack_178;
                local_440[3] = (fVar157 + local_120._12_4_ + 3.0) * fStack_174;
                fStack_430 = (fVar157 + local_120._16_4_ + 4.0) * fStack_170;
                fStack_42c = (fVar157 + local_120._20_4_ + 5.0) * fStack_16c;
                fStack_428 = (fVar157 + local_120._24_4_ + 6.0) * fStack_168;
                fStack_424 = fVar157 + local_120._28_4_ + 7.0;
                local_3e0._0_8_ = auVar192._0_8_;
                local_3e0._8_8_ = auVar192._8_8_;
                local_420 = local_3e0._0_8_;
                uStack_418 = local_3e0._8_8_;
                uStack_410 = 0;
                uStack_408 = 0;
                local_400 = local_560;
                auVar151._8_4_ = 0x7f800000;
                auVar151._0_8_ = 0x7f8000007f800000;
                auVar151._12_4_ = 0x7f800000;
                auVar151._16_4_ = 0x7f800000;
                auVar151._20_4_ = 0x7f800000;
                auVar151._24_4_ = 0x7f800000;
                auVar151._28_4_ = 0x7f800000;
                auVar146 = vblendvps_avx(auVar151,local_560,local_460);
                auVar202 = vshufps_avx(auVar146,auVar146,0xb1);
                auVar202 = vminps_avx(auVar146,auVar202);
                auVar175 = vshufpd_avx(auVar202,auVar202,5);
                auVar202 = vminps_avx(auVar202,auVar175);
                auVar175 = vpermpd_avx2(auVar202,0x4e);
                auVar202 = vminps_avx(auVar202,auVar175);
                auVar202 = vcmpps_avx(auVar146,auVar202,0);
                auVar175 = local_460 & auVar202;
                auVar146 = local_460;
                if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar175 >> 0x7f,0) != '\0') ||
                      (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar175 >> 0xbf,0) != '\0') ||
                    (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar175[0x1f] < '\0') {
                  auVar146 = vandps_avx(auVar202,local_460);
                }
                uVar115 = vmovmskps_avx(auVar146);
                uVar117 = 0;
                for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
                  uVar117 = uVar117 + 1;
                }
                uVar116 = (ulong)uVar117;
                local_3e0 = auVar135;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar157 = local_440[uVar116];
                  uVar121 = *(undefined4 *)((long)&local_420 + uVar116 * 4);
                  fVar156 = 1.0 - fVar157;
                  auVar187 = ZEXT416((uint)(fVar157 * fVar156 * 4.0));
                  auVar192 = vfnmsub213ss_fma(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),auVar187
                                             );
                  auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),auVar187)
                  ;
                  fVar156 = fVar156 * -fVar156 * 0.5;
                  fVar203 = auVar192._0_4_ * 0.5;
                  fVar204 = auVar187._0_4_ * 0.5;
                  fVar205 = fVar157 * fVar157 * 0.5;
                  auVar188._0_4_ = fVar205 * local_820;
                  auVar188._4_4_ = fVar205 * fStack_81c;
                  auVar188._8_4_ = fVar205 * fStack_818;
                  auVar188._12_4_ = fVar205 * fStack_814;
                  auVar160._4_4_ = fVar204;
                  auVar160._0_4_ = fVar204;
                  auVar160._8_4_ = fVar204;
                  auVar160._12_4_ = fVar204;
                  auVar187 = vfmadd132ps_fma(auVar160,auVar188,auVar19);
                  auVar189._4_4_ = fVar203;
                  auVar189._0_4_ = fVar203;
                  auVar189._8_4_ = fVar203;
                  auVar189._12_4_ = fVar203;
                  auVar187 = vfmadd132ps_fma(auVar189,auVar187,auVar9);
                  auVar161._4_4_ = fVar156;
                  auVar161._0_4_ = fVar156;
                  auVar161._8_4_ = fVar156;
                  auVar161._12_4_ = fVar156;
                  auVar187 = vfmadd132ps_fma(auVar161,auVar187,auVar10);
                  auVar179 = ZEXT1664(auVar187);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar116 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar187._0_4_;
                  uVar233 = vextractps_avx(auVar187,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar233;
                  uVar233 = vextractps_avx(auVar187,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar233;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar157;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar121;
                  *(uint *)(ray + k * 4 + 0x220) = uVar16;
                  *(uint *)(ray + k * 4 + 0x240) = uVar113;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_960 = ZEXT1632(CONCAT88(auVar187._8_8_,uVar116));
                  local_740._0_16_ = auVar12;
                  _local_6e0 = ZEXT1632(auVar13);
                  local_680 = local_460;
                  local_4bc = iVar114;
                  local_4b0 = uVar217;
                  uStack_4a8 = uVar98;
                  local_4a0 = uVar99;
                  uStack_498 = uVar100;
                  local_490 = uVar101;
                  uStack_488 = uVar102;
                  local_480 = uVar103;
                  uStack_478 = uVar104;
                  do {
                    auVar146 = local_960;
                    uVar117 = *(uint *)(ray + k * 4 + 0x100);
                    fVar157 = local_440[local_960._0_8_];
                    auVar124._4_4_ = fVar157;
                    auVar124._0_4_ = fVar157;
                    auVar124._8_4_ = fVar157;
                    auVar124._12_4_ = fVar157;
                    local_280._16_4_ = fVar157;
                    local_280._0_16_ = auVar124;
                    local_280._20_4_ = fVar157;
                    local_280._24_4_ = fVar157;
                    local_280._28_4_ = fVar157;
                    uVar121 = *(undefined4 *)((long)&local_420 + local_960._0_8_ * 4);
                    local_260._4_4_ = uVar121;
                    local_260._0_4_ = uVar121;
                    local_260._8_4_ = uVar121;
                    local_260._12_4_ = uVar121;
                    local_260._16_4_ = uVar121;
                    local_260._20_4_ = uVar121;
                    local_260._24_4_ = uVar121;
                    local_260._28_4_ = uVar121;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_400 + local_960._0_8_ * 4);
                    fVar203 = 1.0 - fVar157;
                    auVar187 = ZEXT416((uint)(fVar157 * fVar203 * 4.0));
                    auVar192 = vfnmsub213ss_fma(auVar124,auVar124,auVar187);
                    auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),
                                               auVar187);
                    fVar156 = auVar187._0_4_ * 0.5;
                    fVar157 = fVar157 * fVar157 * 0.5;
                    auVar190._0_4_ = fVar157 * (float)local_6e0._0_4_;
                    auVar190._4_4_ = fVar157 * (float)local_6e0._4_4_;
                    auVar190._8_4_ = fVar157 * (float)uStack_6d8;
                    auVar190._12_4_ = fVar157 * uStack_6d8._4_4_;
                    auVar162._4_4_ = fVar156;
                    auVar162._0_4_ = fVar156;
                    auVar162._8_4_ = fVar156;
                    auVar162._12_4_ = fVar156;
                    auVar187 = vfmadd132ps_fma(auVar162,auVar190,local_740._0_16_);
                    fVar157 = auVar192._0_4_ * 0.5;
                    auVar191._4_4_ = fVar157;
                    auVar191._0_4_ = fVar157;
                    auVar191._8_4_ = fVar157;
                    auVar191._12_4_ = fVar157;
                    auVar187 = vfmadd132ps_fma(auVar191,auVar187,auVar11);
                    local_7f0.context = context->user;
                    fVar157 = fVar203 * -fVar203 * 0.5;
                    auVar163._4_4_ = fVar157;
                    auVar163._0_4_ = fVar157;
                    auVar163._8_4_ = fVar157;
                    auVar163._12_4_ = fVar157;
                    auVar192 = vfmadd132ps_fma(auVar163,auVar187,auVar14);
                    local_2e0 = auVar192._0_4_;
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    auVar187 = vmovshdup_avx(auVar192);
                    auVar180._0_8_ = auVar187._0_8_;
                    auVar180._8_8_ = auVar180._0_8_;
                    auVar183._16_8_ = auVar180._0_8_;
                    auVar183._0_16_ = auVar180;
                    auVar183._24_8_ = auVar180._0_8_;
                    local_2c0 = auVar183;
                    auVar187 = vshufps_avx(auVar192,auVar192,0xaa);
                    auVar164._0_8_ = auVar187._0_8_;
                    auVar164._8_8_ = auVar164._0_8_;
                    auVar177._16_8_ = auVar164._0_8_;
                    auVar177._0_16_ = auVar164;
                    auVar177._24_8_ = auVar164._0_8_;
                    local_2a0 = auVar177;
                    local_240 = CONCAT44(uStack_1bc,local_1c0);
                    uStack_238 = CONCAT44(uStack_1b4,uStack_1b8);
                    uStack_230 = CONCAT44(uStack_1ac,uStack_1b0);
                    uStack_228 = CONCAT44(uStack_1a4,uStack_1a8);
                    local_220 = CONCAT44(uStack_19c,local_1a0);
                    uStack_218 = CONCAT44(uStack_194,uStack_198);
                    uStack_210 = CONCAT44(uStack_18c,uStack_190);
                    uStack_208 = CONCAT44(uStack_184,uStack_188);
                    auVar135 = vpcmpeqd_avx2(local_260,local_260);
                    local_748[1] = auVar135;
                    *local_748 = auVar135;
                    local_200 = (local_7f0.context)->instID[0];
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = (local_7f0.context)->instPrimID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_660 = local_340._0_8_;
                    uStack_658 = local_340._8_8_;
                    uStack_650 = local_340._16_8_;
                    uStack_648 = local_340._24_8_;
                    local_7f0.valid = (int *)&local_660;
                    local_7f0.geometryUserPtr = pGVar17->userPtr;
                    local_7f0.hit = (RTCHitN *)&local_2e0;
                    local_7f0.N = 8;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar177 = ZEXT1632(auVar164);
                      auVar183 = ZEXT1632(auVar180);
                      (*pGVar17->intersectionFilterN)(&local_7f0);
                      auVar155._8_56_ = extraout_var;
                      auVar155._0_8_ = extraout_XMM1_Qa;
                      auVar224 = ZEXT3264(local_7c0);
                      auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                    CONCAT424(fStack_788,
                                                              CONCAT420(fStack_78c,
                                                                        CONCAT416(fStack_790,
                                                                                  CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      auVar135 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                    }
                    auVar105._8_8_ = uStack_658;
                    auVar105._0_8_ = local_660;
                    auVar105._16_8_ = uStack_650;
                    auVar105._24_8_ = uStack_648;
                    auVar175 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar105);
                    auVar202 = auVar135 & ~auVar175;
                    if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar202 >> 0x7f,0) == '\0') &&
                          (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar202 >> 0xbf,0) == '\0') &&
                        (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar202[0x1f]) {
                      auVar175 = auVar175 ^ auVar135;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar177 = ZEXT1632(auVar177._0_16_);
                        auVar183 = ZEXT1632(auVar183._0_16_);
                        (*p_Var18)(&local_7f0);
                        auVar224 = ZEXT3264(local_7c0);
                        auVar221 = ZEXT3264(CONCAT428(fStack_784,
                                                      CONCAT424(fStack_788,
                                                                CONCAT420(fStack_78c,
                                                                          CONCAT416(fStack_790,
                                                                                    CONCAT412(
                                                  fStack_794,
                                                  CONCAT48(fStack_798,CONCAT44(fStack_79c,local_7a0)
                                                          )))))));
                      }
                      auVar106._8_8_ = uStack_658;
                      auVar106._0_8_ = local_660;
                      auVar106._16_8_ = uStack_650;
                      auVar106._24_8_ = uStack_648;
                      auVar202 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar106);
                      auVar135 = vpcmpeqd_avx2(auVar183,auVar183);
                      auVar175 = auVar202 ^ auVar135;
                      auVar22 = vpcmpeqd_avx2(auVar177,auVar177);
                      auVar135 = auVar135 & ~auVar202;
                      if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar135 >> 0x7f,0) != '\0') ||
                            (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar135 >> 0xbf,0) != '\0') ||
                          (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar135[0x1f] < '\0') {
                        auVar202 = auVar202 ^ auVar22;
                        auVar135 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])local_7f0.hit);
                        *(undefined1 (*) [32])(local_7f0.ray + 0x180) = auVar135;
                        auVar135 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1a0) = auVar135;
                        auVar135 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1c0) = auVar135;
                        auVar135 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x1e0) = auVar135;
                        auVar135 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x200) = auVar135;
                        auVar135 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x220) = auVar135;
                        auVar135 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x240) = auVar135;
                        auVar135 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x260) = auVar135;
                        auVar135 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7f0.ray + 0x280) = auVar135;
                      }
                    }
                    auVar135 = local_560;
                    auVar239 = ZEXT464(uVar117);
                    if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar175 >> 0x7f,0) == '\0') &&
                          (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar175 >> 0xbf,0) == '\0') &&
                        (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar175[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar117;
                    }
                    *(undefined4 *)(local_680 + local_960._0_8_ * 4) = 0;
                    uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar138._4_4_ = uVar121;
                    auVar138._0_4_ = uVar121;
                    auVar138._8_4_ = uVar121;
                    auVar138._12_4_ = uVar121;
                    auVar138._16_4_ = uVar121;
                    auVar138._20_4_ = uVar121;
                    auVar138._24_4_ = uVar121;
                    auVar138._28_4_ = uVar121;
                    auVar175 = vcmpps_avx(auVar135,auVar138,2);
                    auVar202 = vandps_avx(auVar175,local_680);
                    auVar175 = local_680 & auVar175;
                    bVar89 = (auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar90 = (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar88 = (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar87 = SUB321(auVar175 >> 0x7f,0) != '\0';
                    bVar86 = (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar85 = SUB321(auVar175 >> 0xbf,0) != '\0';
                    bVar84 = (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar83 = auVar175[0x1f] < '\0';
                    if (((((((bVar89 || bVar90) || bVar88) || bVar87) || bVar86) || bVar85) ||
                        bVar84) || bVar83) {
                      auVar152._8_4_ = 0x7f800000;
                      auVar152._0_8_ = 0x7f8000007f800000;
                      auVar152._12_4_ = 0x7f800000;
                      auVar152._16_4_ = 0x7f800000;
                      auVar152._20_4_ = 0x7f800000;
                      auVar152._24_4_ = 0x7f800000;
                      auVar152._28_4_ = 0x7f800000;
                      auVar135 = vblendvps_avx(auVar152,auVar135,auVar202);
                      auVar175 = vshufps_avx(auVar135,auVar135,0xb1);
                      auVar175 = vminps_avx(auVar135,auVar175);
                      auVar22 = vshufpd_avx(auVar175,auVar175,5);
                      auVar175 = vminps_avx(auVar175,auVar22);
                      auVar22 = vpermpd_avx2(auVar175,0x4e);
                      local_680 = vminps_avx(auVar175,auVar22);
                      auVar175 = vcmpps_avx(auVar135,local_680,0);
                      auVar22 = auVar202 & auVar175;
                      auVar135 = auVar202;
                      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar22 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar22 >> 0x7f,0) != '\0') ||
                            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0xbf,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar22[0x1f] < '\0') {
                        auVar135 = vandps_avx(auVar175,auVar202);
                      }
                      uVar117 = vmovmskps_avx(auVar135);
                      local_960._0_4_ = 0;
                      for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
                        local_960._0_4_ = local_960._0_4_ + 1;
                      }
                      local_960._4_4_ = 0;
                      local_960._8_24_ = auVar146._8_24_;
                    }
                    auVar179 = ZEXT3264(local_680);
                    local_680 = auVar202;
                  } while (((((((bVar89 || bVar90) || bVar88) || bVar87) || bVar86) || bVar85) ||
                           bVar84) || bVar83);
                }
                auVar216 = ZEXT3264(local_780);
              }
            }
            auVar232 = ZEXT3264(auVar139);
          }
          auVar229 = ZEXT3264(auVar126);
          auVar155 = ZEXT3264(local_720);
          lVar120 = lVar120 + 8;
        } while ((int)lVar120 < iVar114);
      }
      uVar121 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar136._4_4_ = uVar121;
      auVar136._0_4_ = uVar121;
      auVar136._8_4_ = uVar121;
      auVar136._12_4_ = uVar121;
      auVar136._16_4_ = uVar121;
      auVar136._20_4_ = uVar121;
      auVar136._24_4_ = uVar121;
      auVar136._28_4_ = uVar121;
      auVar126 = vcmpps_avx(local_80,auVar136,2);
      uVar113 = vmovmskps_avx(auVar126);
      uVar113 = (uint)uVar119 & uVar113;
    } while (uVar113 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }